

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  ulong uVar83;
  RayK<8> *pRVar84;
  byte bVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  ulong uVar89;
  bool bVar90;
  uint uVar91;
  Geometry *geometry;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  long lVar92;
  float fVar93;
  float fVar138;
  float fVar140;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar99 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar144;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar145;
  undefined4 uVar146;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined8 uVar147;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_7d9;
  RTCFilterFunctionNArguments local_7a0;
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  LinearSpace3fa *local_690;
  Primitive *local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  byte local_370;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar83 = (ulong)(byte)PVar12;
  lVar26 = uVar83 * 0x25;
  fVar168 = *(float *)(prim + lVar26 + 0x12);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar97 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar98 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + lVar26 + 6));
  fVar160 = fVar168 * auVar98._0_4_;
  fVar145 = fVar168 * auVar97._0_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar95);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar115 = vpmovsxbd_avx2(auVar96);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar83 * 0xf + 6);
  auVar114 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar108 = vpmovsxbd_avx2(auVar7);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar105 = vcvtdq2ps_avx(auVar108);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar83 + 6);
  auVar106 = vpmovsxbd_avx2(auVar8);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar83 * 0x1a + 6);
  auVar113 = vpmovsxbd_avx2(auVar9);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar83 * 0x1b + 6);
  auVar107 = vpmovsxbd_avx2(auVar10);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar83 * 0x1c + 6);
  auVar102 = vpmovsxbd_avx2(auVar11);
  auVar109 = vcvtdq2ps_avx(auVar102);
  auVar180._4_4_ = fVar145;
  auVar180._0_4_ = fVar145;
  auVar180._8_4_ = fVar145;
  auVar180._12_4_ = fVar145;
  auVar180._16_4_ = fVar145;
  auVar180._20_4_ = fVar145;
  auVar180._24_4_ = fVar145;
  auVar180._28_4_ = fVar145;
  auVar201._8_4_ = 1;
  auVar201._0_8_ = 0x100000001;
  auVar201._12_4_ = 1;
  auVar201._16_4_ = 1;
  auVar201._20_4_ = 1;
  auVar201._24_4_ = 1;
  auVar201._28_4_ = 1;
  auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar111 = ZEXT1632(CONCAT412(fVar168 * auVar97._12_4_,
                                CONCAT48(fVar168 * auVar97._8_4_,
                                         CONCAT44(fVar168 * auVar97._4_4_,fVar145))));
  auVar110 = vpermps_avx2(auVar201,auVar111);
  auVar101 = vpermps_avx512vl(auVar100,auVar111);
  fVar167 = auVar101._0_4_;
  fVar175 = auVar101._4_4_;
  auVar111._4_4_ = fVar175 * auVar115._4_4_;
  auVar111._0_4_ = fVar167 * auVar115._0_4_;
  fVar176 = auVar101._8_4_;
  auVar111._8_4_ = fVar176 * auVar115._8_4_;
  fVar177 = auVar101._12_4_;
  auVar111._12_4_ = fVar177 * auVar115._12_4_;
  fVar161 = auVar101._16_4_;
  auVar111._16_4_ = fVar161 * auVar115._16_4_;
  fVar166 = auVar101._20_4_;
  auVar111._20_4_ = fVar166 * auVar115._20_4_;
  fVar93 = auVar101._24_4_;
  auVar111._24_4_ = fVar93 * auVar115._24_4_;
  auVar111._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar106._4_4_ * fVar175;
  auVar108._0_4_ = auVar106._0_4_ * fVar167;
  auVar108._8_4_ = auVar106._8_4_ * fVar176;
  auVar108._12_4_ = auVar106._12_4_ * fVar177;
  auVar108._16_4_ = auVar106._16_4_ * fVar161;
  auVar108._20_4_ = auVar106._20_4_ * fVar166;
  auVar108._24_4_ = auVar106._24_4_ * fVar93;
  auVar108._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar109._4_4_ * fVar175;
  auVar102._0_4_ = auVar109._0_4_ * fVar167;
  auVar102._8_4_ = auVar109._8_4_ * fVar176;
  auVar102._12_4_ = auVar109._12_4_ * fVar177;
  auVar102._16_4_ = auVar109._16_4_ * fVar161;
  auVar102._20_4_ = auVar109._20_4_ * fVar166;
  auVar102._24_4_ = auVar109._24_4_ * fVar93;
  auVar102._28_4_ = auVar101._28_4_;
  auVar94 = vfmadd231ps_fma(auVar111,auVar110,auVar103);
  auVar95 = vfmadd231ps_fma(auVar108,auVar110,auVar105);
  auVar96 = vfmadd231ps_fma(auVar102,auVar107,auVar110);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar180,auVar104);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar180,auVar114);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar113,auVar180);
  auVar198._4_4_ = fVar160;
  auVar198._0_4_ = fVar160;
  auVar198._8_4_ = fVar160;
  auVar198._12_4_ = fVar160;
  auVar198._16_4_ = fVar160;
  auVar198._20_4_ = fVar160;
  auVar198._24_4_ = fVar160;
  auVar198._28_4_ = fVar160;
  auVar102 = ZEXT1632(CONCAT412(fVar168 * auVar98._12_4_,
                                CONCAT48(fVar168 * auVar98._8_4_,
                                         CONCAT44(fVar168 * auVar98._4_4_,fVar160))));
  auVar108 = vpermps_avx2(auVar201,auVar102);
  auVar102 = vpermps_avx512vl(auVar100,auVar102);
  fVar168 = auVar102._0_4_;
  fVar167 = auVar102._4_4_;
  auVar110._4_4_ = fVar167 * auVar115._4_4_;
  auVar110._0_4_ = fVar168 * auVar115._0_4_;
  fVar175 = auVar102._8_4_;
  auVar110._8_4_ = fVar175 * auVar115._8_4_;
  fVar176 = auVar102._12_4_;
  auVar110._12_4_ = fVar176 * auVar115._12_4_;
  fVar177 = auVar102._16_4_;
  auVar110._16_4_ = fVar177 * auVar115._16_4_;
  fVar161 = auVar102._20_4_;
  auVar110._20_4_ = fVar161 * auVar115._20_4_;
  fVar166 = auVar102._24_4_;
  auVar110._24_4_ = fVar166 * auVar115._24_4_;
  auVar110._28_4_ = fVar145;
  auVar100._4_4_ = auVar106._4_4_ * fVar167;
  auVar100._0_4_ = auVar106._0_4_ * fVar168;
  auVar100._8_4_ = auVar106._8_4_ * fVar175;
  auVar100._12_4_ = auVar106._12_4_ * fVar176;
  auVar100._16_4_ = auVar106._16_4_ * fVar177;
  auVar100._20_4_ = auVar106._20_4_ * fVar161;
  auVar100._24_4_ = auVar106._24_4_ * fVar166;
  auVar100._28_4_ = auVar115._28_4_;
  auVar106._4_4_ = auVar109._4_4_ * fVar167;
  auVar106._0_4_ = auVar109._0_4_ * fVar168;
  auVar106._8_4_ = auVar109._8_4_ * fVar175;
  auVar106._12_4_ = auVar109._12_4_ * fVar176;
  auVar106._16_4_ = auVar109._16_4_ * fVar177;
  auVar106._20_4_ = auVar109._20_4_ * fVar161;
  auVar106._24_4_ = auVar109._24_4_ * fVar166;
  auVar106._28_4_ = auVar102._28_4_;
  auVar6 = vfmadd231ps_fma(auVar110,auVar108,auVar103);
  auVar7 = vfmadd231ps_fma(auVar100,auVar108,auVar105);
  auVar8 = vfmadd231ps_fma(auVar106,auVar108,auVar107);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar198,auVar104);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar198,auVar114);
  auVar190._8_4_ = 0x7fffffff;
  auVar190._0_8_ = 0x7fffffff7fffffff;
  auVar190._12_4_ = 0x7fffffff;
  auVar190._16_4_ = 0x7fffffff;
  auVar190._20_4_ = 0x7fffffff;
  auVar190._24_4_ = 0x7fffffff;
  auVar190._28_4_ = 0x7fffffff;
  auVar155 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar198,auVar113);
  auVar104 = vandps_avx(auVar190,ZEXT1632(auVar94));
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar186._16_4_ = 0x219392ef;
  auVar186._20_4_ = 0x219392ef;
  auVar186._24_4_ = 0x219392ef;
  auVar186._28_4_ = 0x219392ef;
  uVar86 = vcmpps_avx512vl(auVar104,auVar186,1);
  bVar90 = (bool)((byte)uVar86 & 1);
  auVar101._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._0_4_;
  bVar90 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._4_4_;
  bVar90 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._8_4_;
  bVar90 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(auVar190,ZEXT1632(auVar95));
  uVar86 = vcmpps_avx512vl(auVar104,auVar186,1);
  bVar90 = (bool)((byte)uVar86 & 1);
  auVar112._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._0_4_;
  bVar90 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._4_4_;
  bVar90 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._8_4_;
  bVar90 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(auVar190,ZEXT1632(auVar96));
  uVar86 = vcmpps_avx512vl(auVar104,auVar186,1);
  bVar90 = (bool)((byte)uVar86 & 1);
  auVar104._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar96._0_4_;
  bVar90 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar96._4_4_;
  bVar90 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar96._8_4_;
  bVar90 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar96._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar101);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = &DAT_3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar187._16_4_ = 0x3f800000;
  auVar187._20_4_ = 0x3f800000;
  auVar187._24_4_ = 0x3f800000;
  auVar187._28_4_ = 0x3f800000;
  auVar94 = vfnmadd213ps_fma(auVar101,auVar103,auVar187);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar112);
  auVar95 = vfnmadd213ps_fma(auVar112,auVar103,auVar187);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar104);
  auVar96 = vfnmadd213ps_fma(auVar104,auVar103,auVar187);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar103,auVar103);
  fVar168 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar183._4_4_ = fVar168;
  auVar183._0_4_ = fVar168;
  auVar183._8_4_ = fVar168;
  auVar183._12_4_ = fVar168;
  auVar183._16_4_ = fVar168;
  auVar183._20_4_ = fVar168;
  auVar183._24_4_ = fVar168;
  auVar183._28_4_ = fVar168;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0xb + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar104);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar103,auVar183,auVar104);
  auVar104 = vcvtdq2ps_avx(auVar115);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0xd + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar104);
  auVar7 = vfmadd213ps_fma(auVar103,auVar183,auVar104);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x12 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar86 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 2 + uVar86 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar104);
  auVar8 = vfmadd213ps_fma(auVar103,auVar183,auVar104);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x18 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar104);
  auVar9 = vfmadd213ps_fma(auVar103,auVar183,auVar104);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x1d + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar104);
  auVar10 = vfmadd213ps_fma(auVar103,auVar183,auVar104);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar83) + 6)
                           );
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x23 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar104);
  auVar11 = vfmadd213ps_fma(auVar103,auVar183,auVar104);
  auVar104 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar97));
  auVar113._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar113._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar113._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar113._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar113._16_4_ = auVar104._16_4_ * 0.0;
  auVar113._20_4_ = auVar104._20_4_ * 0.0;
  auVar113._24_4_ = auVar104._24_4_ * 0.0;
  auVar113._28_4_ = auVar104._28_4_;
  auVar104 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar97));
  auVar159._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar159._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar159._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar159._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar159._16_4_ = auVar104._16_4_ * 0.0;
  auVar159._20_4_ = auVar104._20_4_ * 0.0;
  auVar159._24_4_ = auVar104._24_4_ * 0.0;
  auVar159._28_4_ = 0;
  auVar104 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar98));
  auVar107._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar107._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar107._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar107._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar107._16_4_ = auVar104._16_4_ * 0.0;
  auVar107._20_4_ = auVar104._20_4_ * 0.0;
  auVar107._24_4_ = auVar104._24_4_ * 0.0;
  auVar107._28_4_ = auVar104._28_4_;
  auVar104 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar98));
  auVar156._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar156._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar156._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar156._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar156._16_4_ = auVar104._16_4_ * 0.0;
  auVar156._20_4_ = auVar104._20_4_ * 0.0;
  auVar156._24_4_ = auVar104._24_4_ * 0.0;
  auVar156._28_4_ = 0;
  auVar104 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar155));
  auVar109._4_4_ = auVar96._4_4_ * auVar104._4_4_;
  auVar109._0_4_ = auVar96._0_4_ * auVar104._0_4_;
  auVar109._8_4_ = auVar96._8_4_ * auVar104._8_4_;
  auVar109._12_4_ = auVar96._12_4_ * auVar104._12_4_;
  auVar109._16_4_ = auVar104._16_4_ * 0.0;
  auVar109._20_4_ = auVar104._20_4_ * 0.0;
  auVar109._24_4_ = auVar104._24_4_ * 0.0;
  auVar109._28_4_ = auVar104._28_4_;
  auVar104 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar155));
  auVar127._0_4_ = auVar96._0_4_ * auVar104._0_4_;
  auVar127._4_4_ = auVar96._4_4_ * auVar104._4_4_;
  auVar127._8_4_ = auVar96._8_4_ * auVar104._8_4_;
  auVar127._12_4_ = auVar96._12_4_ * auVar104._12_4_;
  auVar127._16_4_ = auVar104._16_4_ * 0.0;
  auVar127._20_4_ = auVar104._20_4_ * 0.0;
  auVar127._24_4_ = auVar104._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar113,auVar159);
  auVar103 = vpminsd_avx2(auVar107,auVar156);
  auVar104 = vmaxps_avx(auVar104,auVar103);
  auVar103 = vpminsd_avx2(auVar109,auVar127);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar115._4_4_ = uVar146;
  auVar115._0_4_ = uVar146;
  auVar115._8_4_ = uVar146;
  auVar115._12_4_ = uVar146;
  auVar115._16_4_ = uVar146;
  auVar115._20_4_ = uVar146;
  auVar115._24_4_ = uVar146;
  auVar115._28_4_ = uVar146;
  auVar103 = vmaxps_avx512vl(auVar103,auVar115);
  auVar104 = vmaxps_avx(auVar104,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar104,auVar103);
  auVar104 = vpmaxsd_avx2(auVar113,auVar159);
  auVar103 = vpmaxsd_avx2(auVar107,auVar156);
  auVar104 = vminps_avx(auVar104,auVar103);
  auVar103 = vpmaxsd_avx2(auVar109,auVar127);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar114._4_4_ = uVar146;
  auVar114._0_4_ = uVar146;
  auVar114._8_4_ = uVar146;
  auVar114._12_4_ = uVar146;
  auVar114._16_4_ = uVar146;
  auVar114._20_4_ = uVar146;
  auVar114._24_4_ = uVar146;
  auVar114._28_4_ = uVar146;
  auVar103 = vminps_avx512vl(auVar103,auVar114);
  auVar104 = vminps_avx(auVar104,auVar103);
  auVar105._8_4_ = 0x3f800003;
  auVar105._0_8_ = 0x3f8000033f800003;
  auVar105._12_4_ = 0x3f800003;
  auVar105._16_4_ = 0x3f800003;
  auVar105._20_4_ = 0x3f800003;
  auVar105._24_4_ = 0x3f800003;
  auVar105._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar105);
  auVar103 = vpbroadcastd_avx512vl();
  uVar25 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar147 = vcmpps_avx512vl(local_80,auVar104,2);
  local_7d9 = (byte)((byte)uVar147 & (byte)uVar25) != 0;
  if (local_7d9) {
    uVar86 = (ulong)(byte)((byte)uVar147 & (byte)uVar25);
    local_690 = pre->ray_space + k;
    local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_688 = prim;
    do {
      lVar26 = 0;
      for (uVar83 = uVar86; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar91 = *(uint *)(local_688 + 2);
      pGVar14 = (context->scene->geometries).items[uVar91].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_688 + lVar26 * 4 + 6));
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               CONCAT44(0,*(uint *)(local_688 + lVar26 * 4 + 6)) *
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar168 = (pGVar14->time_range).lower;
      fVar168 = pGVar14->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar168) /
                ((pGVar14->time_range).upper - fVar168));
      auVar94 = vroundss_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),9);
      auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
      auVar94 = vmaxss_avx(ZEXT816(0) << 0x20,auVar94);
      fVar168 = fVar168 - auVar94._0_4_;
      _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar88 = (long)(int)auVar94._0_4_ * 0x38;
      lVar26 = *(long *)(_Var15 + 0x10 + lVar88);
      lVar92 = *(long *)(_Var15 + 0x38 + lVar88);
      lVar16 = *(long *)(_Var15 + 0x48 + lVar88);
      auVar98._4_4_ = fVar168;
      auVar98._0_4_ = fVar168;
      auVar98._8_4_ = fVar168;
      auVar98._12_4_ = fVar168;
      pfVar3 = (float *)(lVar92 + uVar83 * lVar16);
      auVar189._0_4_ = fVar168 * *pfVar3;
      auVar189._4_4_ = fVar168 * pfVar3[1];
      auVar189._8_4_ = fVar168 * pfVar3[2];
      auVar189._12_4_ = fVar168 * pfVar3[3];
      pfVar3 = (float *)(lVar92 + (uVar83 + 1) * lVar16);
      auVar192._0_4_ = fVar168 * *pfVar3;
      auVar192._4_4_ = fVar168 * pfVar3[1];
      auVar192._8_4_ = fVar168 * pfVar3[2];
      auVar192._12_4_ = fVar168 * pfVar3[3];
      auVar94 = vmulps_avx512vl(auVar98,*(undefined1 (*) [16])(lVar92 + (uVar83 + 2) * lVar16));
      auVar95 = vmulps_avx512vl(auVar98,*(undefined1 (*) [16])(lVar92 + lVar16 * (uVar83 + 3)));
      lVar92 = *(long *)(_Var15 + lVar88);
      fVar168 = 1.0 - fVar168;
      auVar97._4_4_ = fVar168;
      auVar97._0_4_ = fVar168;
      auVar97._8_4_ = fVar168;
      auVar97._12_4_ = fVar168;
      local_750 = vfmadd231ps_fma(auVar189,auVar97,*(undefined1 (*) [16])(lVar92 + lVar26 * uVar83))
      ;
      local_510 = vfmadd231ps_fma(auVar192,auVar97,
                                  *(undefined1 (*) [16])(lVar92 + lVar26 * (uVar83 + 1)));
      local_520 = vfmadd231ps_avx512vl
                            (auVar94,auVar97,*(undefined1 (*) [16])(lVar92 + lVar26 * (uVar83 + 2)))
      ;
      local_530 = vfmadd231ps_avx512vl
                            (auVar95,auVar97,*(undefined1 (*) [16])(lVar92 + lVar26 * (uVar83 + 3)))
      ;
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar26 = (long)iVar13 * 0x44;
      auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar96 = vsubps_avx(local_750,auVar94);
      uVar146 = auVar96._0_4_;
      auVar99._4_4_ = uVar146;
      auVar99._0_4_ = uVar146;
      auVar99._8_4_ = uVar146;
      auVar99._12_4_ = uVar146;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      aVar4 = (local_690->vx).field_0;
      aVar5 = (local_690->vy).field_0;
      fVar168 = (local_690->vz).field_0.m128[0];
      fVar145 = *(float *)((long)&(local_690->vz).field_0 + 4);
      fVar167 = *(float *)((long)&(local_690->vz).field_0 + 8);
      fVar175 = *(float *)((long)&(local_690->vz).field_0 + 0xc);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar194._0_4_ = fVar168 * auVar96._0_4_;
      auVar194._4_4_ = fVar145 * auVar96._4_4_;
      auVar194._8_4_ = fVar167 * auVar96._8_4_;
      auVar194._12_4_ = fVar175 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar95);
      auVar6 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar99);
      auVar96 = vsubps_avx(local_510,auVar94);
      uVar146 = auVar96._0_4_;
      auVar157._4_4_ = uVar146;
      auVar157._0_4_ = uVar146;
      auVar157._8_4_ = uVar146;
      auVar157._12_4_ = uVar146;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar195._0_4_ = fVar168 * auVar96._0_4_;
      auVar195._4_4_ = fVar145 * auVar96._4_4_;
      auVar195._8_4_ = fVar167 * auVar96._8_4_;
      auVar195._12_4_ = fVar175 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar95);
      auVar7 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar157);
      auVar96 = vsubps_avx512vl(local_520,auVar94);
      uVar146 = auVar96._0_4_;
      auVar158._4_4_ = uVar146;
      auVar158._0_4_ = uVar146;
      auVar158._8_4_ = uVar146;
      auVar158._12_4_ = uVar146;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar196._0_4_ = fVar168 * auVar96._0_4_;
      auVar196._4_4_ = fVar145 * auVar96._4_4_;
      auVar196._8_4_ = fVar167 * auVar96._8_4_;
      auVar196._12_4_ = fVar175 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar95);
      auVar96 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar158);
      auVar95 = vsubps_avx512vl(local_530,auVar94);
      uVar146 = auVar95._0_4_;
      auVar155._4_4_ = uVar146;
      auVar155._0_4_ = uVar146;
      auVar155._8_4_ = uVar146;
      auVar155._12_4_ = uVar146;
      auVar94 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar200._0_4_ = fVar168 * auVar95._0_4_;
      auVar200._4_4_ = fVar145 * auVar95._4_4_;
      auVar200._8_4_ = fVar167 * auVar95._8_4_;
      auVar200._12_4_ = fVar175 * auVar95._12_4_;
      auVar94 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar94);
      auVar8 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar155);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar146 = auVar6._0_4_;
      local_560._4_4_ = uVar146;
      local_560._0_4_ = uVar146;
      local_560._8_4_ = uVar146;
      local_560._12_4_ = uVar146;
      local_560._16_4_ = uVar146;
      local_560._20_4_ = uVar146;
      local_560._24_4_ = uVar146;
      local_560._28_4_ = uVar146;
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      auVar152._8_4_ = 1;
      auVar152._0_8_ = 0x100000001;
      auVar152._12_4_ = 1;
      auVar152._16_4_ = 1;
      auVar152._20_4_ = 1;
      auVar152._24_4_ = 1;
      auVar152._28_4_ = 1;
      local_500 = vpermps_avx2(auVar152,ZEXT1632(auVar6));
      local_580 = vbroadcastss_avx512vl(auVar7);
      local_5a0 = vpermps_avx512vl(auVar152,ZEXT1632(auVar7));
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      local_700 = vbroadcastss_avx512vl(auVar96);
      local_5e0 = vpermps_avx512vl(auVar152,ZEXT1632(auVar96));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar8);
      auVar211 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar152,ZEXT1632(auVar8));
      auVar212 = ZEXT3264(local_620);
      auVar105 = vmulps_avx512vl(local_600,auVar114);
      auVar106 = vmulps_avx512vl(local_620,auVar114);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_700);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_5e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_580);
      auVar107 = vfmadd231ps_avx512vl(auVar106,auVar103,local_5a0);
      auVar108 = vfmadd231ps_avx512vl(auVar105,auVar104,local_560);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      auVar102 = vfmadd231ps_avx512vl(auVar107,auVar104,local_500);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0xd8c);
      auVar109 = vmulps_avx512vl(local_600,auVar107);
      auVar110 = vmulps_avx512vl(local_620,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar113,local_700);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,local_5e0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,local_580);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,local_5a0);
      auVar9 = vfmadd231ps_fma(auVar109,auVar105,local_560);
      auVar10 = vfmadd231ps_fma(auVar110,auVar105,local_500);
      auVar110 = vsubps_avx512vl(ZEXT1632(auVar9),auVar108);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar10),auVar102);
      auVar109 = vmulps_avx512vl(auVar102,auVar110);
      auVar100 = vmulps_avx512vl(auVar108,auVar111);
      auVar109 = vsubps_avx512vl(auVar109,auVar100);
      auVar94 = vshufps_avx(local_750,local_750,0xff);
      uVar147 = auVar94._0_8_;
      local_a0._8_8_ = uVar147;
      local_a0._0_8_ = uVar147;
      local_a0._16_8_ = uVar147;
      local_a0._24_8_ = uVar147;
      auVar94 = vshufps_avx(local_510,local_510,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_520,local_520,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_530,local_530,0xff);
      uVar147 = auVar94._0_8_;
      register0x00001248 = uVar147;
      local_100 = uVar147;
      register0x00001250 = uVar147;
      register0x00001258 = uVar147;
      auVar100 = vmulps_avx512vl(_local_100,auVar114);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,local_e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_a0);
      auVar101 = vmulps_avx512vl(_local_100,auVar107);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar113,local_e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_c0);
      auVar11 = vfmadd231ps_fma(auVar101,auVar105,local_a0);
      auVar101 = vmulps_avx512vl(auVar111,auVar111);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,auVar110);
      auVar112 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar11));
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      auVar101 = vmulps_avx512vl(auVar112,auVar101);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      uVar147 = vcmpps_avx512vl(auVar109,auVar101,2);
      auVar94 = vblendps_avx(auVar6,local_750,8);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vblendps_avx(auVar7,local_510,8);
      auVar94 = vandps_avx512vl(auVar94,auVar97);
      auVar95 = vmaxps_avx(auVar95,auVar94);
      auVar94 = vblendps_avx(auVar96,local_520,8);
      auVar98 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vblendps_avx(auVar8,local_530,8);
      auVar94 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vmaxps_avx(auVar98,auVar94);
      auVar94 = vmaxps_avx(auVar95,auVar94);
      auVar95 = vmovshdup_avx(auVar94);
      auVar95 = vmaxss_avx(auVar95,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar95);
      auVar95 = vcvtsi2ss_avx512f(local_520,iVar13);
      local_460._0_16_ = auVar95;
      auVar191._0_4_ = auVar95._0_4_;
      auVar191._4_4_ = auVar191._0_4_;
      auVar191._8_4_ = auVar191._0_4_;
      auVar191._12_4_ = auVar191._0_4_;
      auVar191._16_4_ = auVar191._0_4_;
      auVar191._20_4_ = auVar191._0_4_;
      auVar191._24_4_ = auVar191._0_4_;
      auVar191._28_4_ = auVar191._0_4_;
      uVar25 = vcmpps_avx512vl(auVar191,_DAT_02020f40,0xe);
      local_370 = (byte)uVar147 & (byte)uVar25;
      fVar145 = auVar94._0_4_ * 4.7683716e-07;
      auVar164._8_4_ = 2;
      auVar164._0_8_ = 0x200000002;
      auVar164._12_4_ = 2;
      auVar164._16_4_ = 2;
      auVar164._20_4_ = 2;
      auVar164._24_4_ = 2;
      auVar164._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar164,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar164,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar164,ZEXT1632(auVar96));
      auVar109 = vpermps_avx2(auVar164,ZEXT1632(auVar8));
      fVar168 = *(float *)(ray + k * 4 + 0x60);
      auVar94 = auVar111._0_16_;
      _local_770 = ZEXT416((uint)fVar145);
      if (local_370 == 0) {
        bVar90 = false;
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar209 = ZEXT1664(auVar94);
        auVar206 = ZEXT3264(local_560);
        auVar207 = ZEXT3264(local_500);
        auVar208 = ZEXT3264(local_580);
        auVar205 = ZEXT3264(local_5a0);
        auVar213 = ZEXT3264(local_700);
        auVar210 = ZEXT3264(local_5e0);
      }
      else {
        fStack_63c = 0.0;
        fStack_638 = 0.0;
        fStack_634 = 0.0;
        auVar107 = vmulps_avx512vl(auVar109,auVar107);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_140,auVar113);
        auVar106 = vfmadd213ps_avx512vl(auVar105,local_120,auVar106);
        auVar114 = vmulps_avx512vl(auVar109,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar114);
        auVar113 = vfmadd213ps_avx512vl(auVar103,local_140,auVar115);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1f9c);
        auVar113 = vfmadd213ps_avx512vl(auVar104,local_120,auVar113);
        auVar104 = vmulps_avx512vl(local_600,auVar105);
        auVar107 = vmulps_avx512vl(local_620,auVar105);
        auVar197._0_4_ = auVar109._0_4_ * auVar105._0_4_;
        auVar197._4_4_ = auVar109._4_4_ * auVar105._4_4_;
        auVar197._8_4_ = auVar109._8_4_ * auVar105._8_4_;
        auVar197._12_4_ = auVar109._12_4_ * auVar105._12_4_;
        auVar197._16_4_ = auVar109._16_4_ * auVar105._16_4_;
        auVar197._20_4_ = auVar109._20_4_ * auVar105._20_4_;
        auVar197._24_4_ = auVar109._24_4_ * auVar105._24_4_;
        auVar197._28_4_ = 0;
        auVar213 = ZEXT3264(local_700);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_700);
        auVar105 = vfmadd231ps_avx512vl(auVar107,auVar114,local_5e0);
        auVar114 = vfmadd231ps_avx512vl(auVar197,local_160,auVar114);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_580);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_5a0);
        auVar107 = vfmadd231ps_avx512vl(auVar114,local_140,auVar115);
        auVar101 = vfmadd231ps_avx512vl(auVar104,auVar103,local_560);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_500);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1f9c);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_120,auVar103);
        auVar103 = vmulps_avx512vl(local_600,auVar114);
        auVar112 = vmulps_avx512vl(local_620,auVar114);
        auVar36._4_4_ = auVar109._4_4_ * auVar114._4_4_;
        auVar36._0_4_ = auVar109._0_4_ * auVar114._0_4_;
        auVar36._8_4_ = auVar109._8_4_ * auVar114._8_4_;
        auVar36._12_4_ = auVar109._12_4_ * auVar114._12_4_;
        auVar36._16_4_ = auVar109._16_4_ * auVar114._16_4_;
        auVar36._20_4_ = auVar109._20_4_ * auVar114._20_4_;
        auVar36._24_4_ = auVar109._24_4_ * auVar114._24_4_;
        auVar36._28_4_ = auVar114._28_4_;
        auVar114 = vfmadd231ps_avx512vl(auVar103,auVar115,local_700);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_5e0);
        auVar115 = vfmadd231ps_avx512vl(auVar36,local_160,auVar115);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar103,local_580);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,local_5a0);
        auVar103 = vfmadd231ps_avx512vl(auVar115,local_140,auVar103);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar104,local_560);
        auVar114 = vfmadd231ps_avx512vl(auVar112,auVar104,local_500);
        auVar112 = vfmadd231ps_avx512vl(auVar103,local_120,auVar104);
        auVar202._8_4_ = 0x7fffffff;
        auVar202._0_8_ = 0x7fffffff7fffffff;
        auVar202._12_4_ = 0x7fffffff;
        auVar202._16_4_ = 0x7fffffff;
        auVar202._20_4_ = 0x7fffffff;
        auVar202._24_4_ = 0x7fffffff;
        auVar202._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar101,auVar202);
        auVar103 = vandps_avx(auVar105,auVar202);
        auVar103 = vmaxps_avx(auVar104,auVar103);
        auVar104 = vandps_avx(auVar107,auVar202);
        auVar104 = vmaxps_avx(auVar103,auVar104);
        auVar107 = vbroadcastss_avx512vl(_local_770);
        uVar83 = vcmpps_avx512vl(auVar104,auVar107,1);
        bVar90 = (bool)((byte)uVar83 & 1);
        auVar116._0_4_ = (float)((uint)bVar90 * auVar110._0_4_ | (uint)!bVar90 * auVar101._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar90 * auVar110._4_4_ | (uint)!bVar90 * auVar101._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar90 * auVar110._8_4_ | (uint)!bVar90 * auVar101._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar90 * auVar110._12_4_ | (uint)!bVar90 * auVar101._12_4_);
        bVar90 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar90 * auVar110._16_4_ | (uint)!bVar90 * auVar101._16_4_);
        bVar90 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar90 * auVar110._20_4_ | (uint)!bVar90 * auVar101._20_4_);
        bVar90 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar90 * auVar110._24_4_ | (uint)!bVar90 * auVar101._24_4_);
        bVar90 = SUB81(uVar83 >> 7,0);
        auVar116._28_4_ = (uint)bVar90 * auVar110._28_4_ | (uint)!bVar90 * auVar101._28_4_;
        bVar90 = (bool)((byte)uVar83 & 1);
        auVar117._0_4_ = (float)((uint)bVar90 * auVar111._0_4_ | (uint)!bVar90 * auVar105._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar90 * auVar111._4_4_ | (uint)!bVar90 * auVar105._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar90 * auVar111._8_4_ | (uint)!bVar90 * auVar105._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar90 * auVar111._12_4_ | (uint)!bVar90 * auVar105._12_4_);
        bVar90 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar90 * auVar111._16_4_ | (uint)!bVar90 * auVar105._16_4_);
        bVar90 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar90 * auVar111._20_4_ | (uint)!bVar90 * auVar105._20_4_);
        bVar90 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar90 * auVar111._24_4_ | (uint)!bVar90 * auVar105._24_4_);
        bVar90 = SUB81(uVar83 >> 7,0);
        auVar117._28_4_ = (uint)bVar90 * auVar111._28_4_ | (uint)!bVar90 * auVar105._28_4_;
        auVar104 = vandps_avx(auVar202,auVar115);
        auVar103 = vandps_avx(auVar114,auVar202);
        auVar103 = vmaxps_avx(auVar104,auVar103);
        auVar104 = vandps_avx(auVar112,auVar202);
        auVar104 = vmaxps_avx(auVar103,auVar104);
        uVar83 = vcmpps_avx512vl(auVar104,auVar107,1);
        bVar90 = (bool)((byte)uVar83 & 1);
        auVar118._0_4_ = (float)((uint)bVar90 * auVar110._0_4_ | (uint)!bVar90 * auVar115._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar90 * auVar110._4_4_ | (uint)!bVar90 * auVar115._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar90 * auVar110._8_4_ | (uint)!bVar90 * auVar115._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar90 * auVar110._12_4_ | (uint)!bVar90 * auVar115._12_4_);
        bVar90 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar90 * auVar110._16_4_ | (uint)!bVar90 * auVar115._16_4_);
        bVar90 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar90 * auVar110._20_4_ | (uint)!bVar90 * auVar115._20_4_);
        bVar90 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar90 * auVar110._24_4_ | (uint)!bVar90 * auVar115._24_4_);
        bVar90 = SUB81(uVar83 >> 7,0);
        auVar118._28_4_ = (uint)bVar90 * auVar110._28_4_ | (uint)!bVar90 * auVar115._28_4_;
        bVar90 = (bool)((byte)uVar83 & 1);
        auVar119._0_4_ = (float)((uint)bVar90 * auVar111._0_4_ | (uint)!bVar90 * auVar114._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar90 * auVar111._4_4_ | (uint)!bVar90 * auVar114._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar90 * auVar111._8_4_ | (uint)!bVar90 * auVar114._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar90 * auVar111._12_4_ | (uint)!bVar90 * auVar114._12_4_);
        bVar90 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar90 * auVar111._16_4_ | (uint)!bVar90 * auVar114._16_4_);
        bVar90 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar90 * auVar111._20_4_ | (uint)!bVar90 * auVar114._20_4_);
        bVar90 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar90 * auVar111._24_4_ | (uint)!bVar90 * auVar114._24_4_);
        bVar90 = SUB81(uVar83 >> 7,0);
        auVar119._28_4_ = (uint)bVar90 * auVar111._28_4_ | (uint)!bVar90 * auVar114._28_4_;
        auVar99 = vxorps_avx512vl(auVar94,auVar94);
        auVar209 = ZEXT1664(auVar99);
        auVar104 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar99));
        auVar94 = vfmadd231ps_fma(auVar104,auVar117,auVar117);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar167 = auVar104._0_4_;
        fVar175 = auVar104._4_4_;
        fVar176 = auVar104._8_4_;
        fVar177 = auVar104._12_4_;
        fVar161 = auVar104._16_4_;
        fVar166 = auVar104._20_4_;
        fVar93 = auVar104._24_4_;
        auVar37._4_4_ = fVar175 * fVar175 * fVar175 * auVar94._4_4_ * -0.5;
        auVar37._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_ * -0.5;
        auVar37._8_4_ = fVar176 * fVar176 * fVar176 * auVar94._8_4_ * -0.5;
        auVar37._12_4_ = fVar177 * fVar177 * fVar177 * auVar94._12_4_ * -0.5;
        auVar37._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar37._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar37._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
        auVar37._28_4_ = auVar112._28_4_;
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar104 = vfmadd231ps_avx512vl(auVar37,auVar103,auVar104);
        auVar38._4_4_ = auVar117._4_4_ * auVar104._4_4_;
        auVar38._0_4_ = auVar117._0_4_ * auVar104._0_4_;
        auVar38._8_4_ = auVar117._8_4_ * auVar104._8_4_;
        auVar38._12_4_ = auVar117._12_4_ * auVar104._12_4_;
        auVar38._16_4_ = auVar117._16_4_ * auVar104._16_4_;
        auVar38._20_4_ = auVar117._20_4_ * auVar104._20_4_;
        auVar38._24_4_ = auVar117._24_4_ * auVar104._24_4_;
        auVar38._28_4_ = 0;
        auVar39._4_4_ = auVar104._4_4_ * -auVar116._4_4_;
        auVar39._0_4_ = auVar104._0_4_ * -auVar116._0_4_;
        auVar39._8_4_ = auVar104._8_4_ * -auVar116._8_4_;
        auVar39._12_4_ = auVar104._12_4_ * -auVar116._12_4_;
        auVar39._16_4_ = auVar104._16_4_ * -auVar116._16_4_;
        auVar39._20_4_ = auVar104._20_4_ * -auVar116._20_4_;
        auVar39._24_4_ = auVar104._24_4_ * -auVar116._24_4_;
        auVar39._28_4_ = auVar117._28_4_;
        auVar104 = vmulps_avx512vl(auVar104,ZEXT1632(auVar99));
        auVar110 = ZEXT1632(auVar99);
        auVar115 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar110);
        auVar94 = vfmadd231ps_fma(auVar115,auVar119,auVar119);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar167 = auVar115._0_4_;
        fVar175 = auVar115._4_4_;
        fVar176 = auVar115._8_4_;
        fVar177 = auVar115._12_4_;
        fVar161 = auVar115._16_4_;
        fVar166 = auVar115._20_4_;
        fVar93 = auVar115._24_4_;
        auVar40._4_4_ = fVar175 * fVar175 * fVar175 * auVar94._4_4_ * -0.5;
        auVar40._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_ * -0.5;
        auVar40._8_4_ = fVar176 * fVar176 * fVar176 * auVar94._8_4_ * -0.5;
        auVar40._12_4_ = fVar177 * fVar177 * fVar177 * auVar94._12_4_ * -0.5;
        auVar40._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar40._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar40._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
        auVar40._28_4_ = 0;
        auVar103 = vfmadd231ps_avx512vl(auVar40,auVar103,auVar115);
        auVar41._4_4_ = auVar119._4_4_ * auVar103._4_4_;
        auVar41._0_4_ = auVar119._0_4_ * auVar103._0_4_;
        auVar41._8_4_ = auVar119._8_4_ * auVar103._8_4_;
        auVar41._12_4_ = auVar119._12_4_ * auVar103._12_4_;
        auVar41._16_4_ = auVar119._16_4_ * auVar103._16_4_;
        auVar41._20_4_ = auVar119._20_4_ * auVar103._20_4_;
        auVar41._24_4_ = auVar119._24_4_ * auVar103._24_4_;
        auVar41._28_4_ = auVar115._28_4_;
        auVar42._4_4_ = -auVar118._4_4_ * auVar103._4_4_;
        auVar42._0_4_ = -auVar118._0_4_ * auVar103._0_4_;
        auVar42._8_4_ = -auVar118._8_4_ * auVar103._8_4_;
        auVar42._12_4_ = -auVar118._12_4_ * auVar103._12_4_;
        auVar42._16_4_ = -auVar118._16_4_ * auVar103._16_4_;
        auVar42._20_4_ = -auVar118._20_4_ * auVar103._20_4_;
        auVar42._24_4_ = -auVar118._24_4_ * auVar103._24_4_;
        auVar42._28_4_ = auVar118._28_4_ ^ 0x80000000;
        auVar103 = vmulps_avx512vl(auVar103,auVar110);
        auVar94 = vfmadd213ps_fma(auVar38,auVar100,auVar108);
        auVar95 = vfmadd213ps_fma(auVar39,auVar100,auVar102);
        auVar115 = vfmadd213ps_avx512vl(auVar104,auVar100,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar97 = vfnmadd213ps_fma(auVar38,auVar100,auVar108);
        auVar107 = ZEXT1632(auVar11);
        auVar96 = vfmadd213ps_fma(auVar42,auVar107,ZEXT1632(auVar10));
        auVar98 = vfnmadd213ps_fma(auVar39,auVar100,auVar102);
        auVar6 = vfmadd213ps_fma(auVar103,auVar107,auVar106);
        auVar105 = vfnmadd231ps_avx512vl(auVar113,auVar100,auVar104);
        auVar9 = vfnmadd213ps_fma(auVar41,auVar107,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar42,auVar107,ZEXT1632(auVar10));
        auVar155 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar11),auVar103);
        auVar103 = vsubps_avx512vl(auVar114,ZEXT1632(auVar97));
        auVar104 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar98));
        auVar106 = vsubps_avx512vl(ZEXT1632(auVar6),auVar105);
        auVar113 = vmulps_avx512vl(auVar104,auVar105);
        auVar7 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar98),auVar106);
        auVar43._4_4_ = auVar97._4_4_ * auVar106._4_4_;
        auVar43._0_4_ = auVar97._0_4_ * auVar106._0_4_;
        auVar43._8_4_ = auVar97._8_4_ * auVar106._8_4_;
        auVar43._12_4_ = auVar97._12_4_ * auVar106._12_4_;
        auVar43._16_4_ = auVar106._16_4_ * 0.0;
        auVar43._20_4_ = auVar106._20_4_ * 0.0;
        auVar43._24_4_ = auVar106._24_4_ * 0.0;
        auVar43._28_4_ = auVar106._28_4_;
        auVar106 = vfmsub231ps_avx512vl(auVar43,auVar105,auVar103);
        auVar44._4_4_ = auVar98._4_4_ * auVar103._4_4_;
        auVar44._0_4_ = auVar98._0_4_ * auVar103._0_4_;
        auVar44._8_4_ = auVar98._8_4_ * auVar103._8_4_;
        auVar44._12_4_ = auVar98._12_4_ * auVar103._12_4_;
        auVar44._16_4_ = auVar103._16_4_ * 0.0;
        auVar44._20_4_ = auVar103._20_4_ * 0.0;
        auVar44._24_4_ = auVar103._24_4_ * 0.0;
        auVar44._28_4_ = auVar103._28_4_;
        auVar8 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar97),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar110,auVar106);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar7));
        auVar111 = ZEXT1632(auVar99);
        uVar83 = vcmpps_avx512vl(auVar104,auVar111,2);
        bVar85 = (byte)uVar83;
        fVar93 = (float)((uint)(bVar85 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar9._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar138 = (float)((uint)bVar90 * auVar94._4_4_ | (uint)!bVar90 * auVar9._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar140 = (float)((uint)bVar90 * auVar94._8_4_ | (uint)!bVar90 * auVar9._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar142 = (float)((uint)bVar90 * auVar94._12_4_ | (uint)!bVar90 * auVar9._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar93))));
        fVar160 = (float)((uint)(bVar85 & 1) * auVar95._0_4_ |
                         (uint)!(bool)(bVar85 & 1) * auVar10._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar139 = (float)((uint)bVar90 * auVar95._4_4_ | (uint)!bVar90 * auVar10._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar141 = (float)((uint)bVar90 * auVar95._8_4_ | (uint)!bVar90 * auVar10._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar143 = (float)((uint)bVar90 * auVar95._12_4_ | (uint)!bVar90 * auVar10._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar160))));
        auVar120._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar155._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar90 * auVar115._4_4_ | (uint)!bVar90 * auVar155._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar90 * auVar115._8_4_ | (uint)!bVar90 * auVar155._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar90 * auVar115._12_4_ | (uint)!bVar90 * auVar155._12_4_);
        fVar175 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
        auVar120._16_4_ = fVar175;
        fVar167 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
        auVar120._20_4_ = fVar167;
        fVar176 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
        auVar120._24_4_ = fVar176;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar120._28_4_ = iVar1;
        auVar103 = vblendmps_avx512vl(ZEXT1632(auVar97),auVar114);
        auVar121._0_4_ =
             (uint)(bVar85 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar7._0_4_;
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar90 * auVar103._4_4_ | (uint)!bVar90 * auVar7._4_4_;
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar90 * auVar103._8_4_ | (uint)!bVar90 * auVar7._8_4_;
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar90 * auVar103._12_4_ | (uint)!bVar90 * auVar7._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
        auVar103 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar96));
        auVar122._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar95._0_4_
                    );
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar90 * auVar103._4_4_ | (uint)!bVar90 * auVar95._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar90 * auVar103._8_4_ | (uint)!bVar90 * auVar95._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar90 * auVar103._12_4_ | (uint)!bVar90 * auVar95._12_4_);
        fVar177 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_);
        auVar122._16_4_ = fVar177;
        fVar161 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_);
        auVar122._20_4_ = fVar161;
        fVar166 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_);
        auVar122._24_4_ = fVar166;
        auVar122._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
        auVar103 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar6));
        auVar123._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar103._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar115._0_4_);
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar90 * auVar103._4_4_ | (uint)!bVar90 * auVar115._4_4_);
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar90 * auVar103._8_4_ | (uint)!bVar90 * auVar115._8_4_);
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar90 * auVar103._12_4_ | (uint)!bVar90 * auVar115._12_4_);
        bVar90 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar90 * auVar103._16_4_ | (uint)!bVar90 * auVar115._16_4_);
        bVar90 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar90 * auVar103._20_4_ | (uint)!bVar90 * auVar115._20_4_);
        bVar90 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar90 * auVar103._24_4_ | (uint)!bVar90 * auVar115._24_4_);
        bVar90 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = (uint)bVar90 * auVar103._28_4_ | (uint)!bVar90 * auVar115._28_4_;
        auVar124._0_4_ =
             (uint)(bVar85 & 1) * (int)auVar97._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar114._0_4_;
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar90 * (int)auVar97._4_4_ | (uint)!bVar90 * auVar114._4_4_;
        bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar90 * (int)auVar97._8_4_ | (uint)!bVar90 * auVar114._8_4_;
        bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar90 * (int)auVar97._12_4_ | (uint)!bVar90 * auVar114._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar114._28_4_;
        bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar85 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar6._0_4_;
        bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar18 * auVar105._4_4_ | (uint)!bVar18 * auVar6._4_4_;
        bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar18 * auVar105._8_4_ | (uint)!bVar18 * auVar6._8_4_;
        bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar18 * auVar105._12_4_ | (uint)!bVar18 * auVar6._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar105._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar105._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar105._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar105._28_4_;
        auVar125._28_4_ = iVar2;
        auVar108 = vsubps_avx512vl(auVar124,auVar113);
        auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar98._12_4_ |
                                                 (uint)!bVar20 * auVar96._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar98._8_4_ |
                                                          (uint)!bVar19 * auVar96._8_4_,
                                                          CONCAT44((uint)bVar90 * (int)auVar98._4_4_
                                                                   | (uint)!bVar90 * auVar96._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar98._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar96._0_4_)))),auVar107);
        auVar115 = vsubps_avx(auVar125,auVar120);
        auVar114 = vsubps_avx(auVar113,auVar121);
        auVar105 = vsubps_avx(auVar107,auVar122);
        auVar106 = vsubps_avx(auVar120,auVar123);
        auVar45._4_4_ = auVar115._4_4_ * fVar138;
        auVar45._0_4_ = auVar115._0_4_ * fVar93;
        auVar45._8_4_ = auVar115._8_4_ * fVar140;
        auVar45._12_4_ = auVar115._12_4_ * fVar142;
        auVar45._16_4_ = auVar115._16_4_ * 0.0;
        auVar45._20_4_ = auVar115._20_4_ * 0.0;
        auVar45._24_4_ = auVar115._24_4_ * 0.0;
        auVar45._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar45,auVar120,auVar108);
        auVar46._4_4_ = fVar139 * auVar108._4_4_;
        auVar46._0_4_ = fVar160 * auVar108._0_4_;
        auVar46._8_4_ = fVar141 * auVar108._8_4_;
        auVar46._12_4_ = fVar143 * auVar108._12_4_;
        auVar46._16_4_ = auVar108._16_4_ * 0.0;
        auVar46._20_4_ = auVar108._20_4_ * 0.0;
        auVar46._24_4_ = auVar108._24_4_ * 0.0;
        auVar46._28_4_ = auVar104._28_4_;
        auVar95 = vfmsub231ps_fma(auVar46,auVar113,auVar103);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar111,ZEXT1632(auVar94));
        auVar169._0_4_ = auVar103._0_4_ * auVar120._0_4_;
        auVar169._4_4_ = auVar103._4_4_ * auVar120._4_4_;
        auVar169._8_4_ = auVar103._8_4_ * auVar120._8_4_;
        auVar169._12_4_ = auVar103._12_4_ * auVar120._12_4_;
        auVar169._16_4_ = auVar103._16_4_ * fVar175;
        auVar169._20_4_ = auVar103._20_4_ * fVar167;
        auVar169._24_4_ = auVar103._24_4_ * fVar176;
        auVar169._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar169,auVar107,auVar115);
        auVar102 = vfmadd231ps_avx512vl(auVar104,auVar111,ZEXT1632(auVar94));
        auVar104 = vmulps_avx512vl(auVar106,auVar121);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar123);
        auVar47._4_4_ = auVar105._4_4_ * auVar123._4_4_;
        auVar47._0_4_ = auVar105._0_4_ * auVar123._0_4_;
        auVar47._8_4_ = auVar105._8_4_ * auVar123._8_4_;
        auVar47._12_4_ = auVar105._12_4_ * auVar123._12_4_;
        auVar47._16_4_ = auVar105._16_4_ * auVar123._16_4_;
        auVar47._20_4_ = auVar105._20_4_ * auVar123._20_4_;
        auVar47._24_4_ = auVar105._24_4_ * auVar123._24_4_;
        auVar47._28_4_ = auVar123._28_4_;
        auVar94 = vfmsub231ps_fma(auVar47,auVar122,auVar106);
        auVar170._0_4_ = auVar122._0_4_ * auVar114._0_4_;
        auVar170._4_4_ = auVar122._4_4_ * auVar114._4_4_;
        auVar170._8_4_ = auVar122._8_4_ * auVar114._8_4_;
        auVar170._12_4_ = auVar122._12_4_ * auVar114._12_4_;
        auVar170._16_4_ = fVar177 * auVar114._16_4_;
        auVar170._20_4_ = fVar161 * auVar114._20_4_;
        auVar170._24_4_ = fVar166 * auVar114._24_4_;
        auVar170._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar170,auVar105,auVar121);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar111,auVar104);
        auVar110 = vfmadd231ps_avx512vl(auVar104,auVar111,ZEXT1632(auVar94));
        auVar104 = vmaxps_avx(auVar102,auVar110);
        uVar147 = vcmpps_avx512vl(auVar104,auVar111,2);
        local_370 = local_370 & (byte)uVar147;
        auVar206 = ZEXT3264(local_560);
        auVar207 = ZEXT3264(local_500);
        auVar208 = ZEXT3264(local_580);
        auVar205 = ZEXT3264(local_5a0);
        auVar199 = ZEXT1664(_local_770);
        if (local_370 == 0) {
          local_370 = 0;
        }
        else {
          auVar48._4_4_ = auVar106._4_4_ * auVar103._4_4_;
          auVar48._0_4_ = auVar106._0_4_ * auVar103._0_4_;
          auVar48._8_4_ = auVar106._8_4_ * auVar103._8_4_;
          auVar48._12_4_ = auVar106._12_4_ * auVar103._12_4_;
          auVar48._16_4_ = auVar106._16_4_ * auVar103._16_4_;
          auVar48._20_4_ = auVar106._20_4_ * auVar103._20_4_;
          auVar48._24_4_ = auVar106._24_4_ * auVar103._24_4_;
          auVar48._28_4_ = auVar104._28_4_;
          auVar96 = vfmsub231ps_fma(auVar48,auVar105,auVar115);
          auVar49._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar49._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar49._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar49._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar49._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar49._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar49._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar49._28_4_ = auVar115._28_4_;
          auVar95 = vfmsub231ps_fma(auVar49,auVar108,auVar106);
          auVar50._4_4_ = auVar105._4_4_ * auVar108._4_4_;
          auVar50._0_4_ = auVar105._0_4_ * auVar108._0_4_;
          auVar50._8_4_ = auVar105._8_4_ * auVar108._8_4_;
          auVar50._12_4_ = auVar105._12_4_ * auVar108._12_4_;
          auVar50._16_4_ = auVar105._16_4_ * auVar108._16_4_;
          auVar50._20_4_ = auVar105._20_4_ * auVar108._20_4_;
          auVar50._24_4_ = auVar105._24_4_ * auVar108._24_4_;
          auVar50._28_4_ = auVar105._28_4_;
          auVar6 = vfmsub231ps_fma(auVar50,auVar114,auVar103);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar6));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar96),auVar111);
          auVar103 = vrcp14ps_avx512vl(auVar104);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = &DAT_3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar115 = vfnmadd213ps_avx512vl(auVar103,auVar104,auVar27);
          auVar94 = vfmadd132ps_fma(auVar115,auVar103,auVar103);
          auVar51._4_4_ = auVar6._4_4_ * auVar120._4_4_;
          auVar51._0_4_ = auVar6._0_4_ * auVar120._0_4_;
          auVar51._8_4_ = auVar6._8_4_ * auVar120._8_4_;
          auVar51._12_4_ = auVar6._12_4_ * auVar120._12_4_;
          auVar51._16_4_ = fVar175 * 0.0;
          auVar51._20_4_ = fVar167 * 0.0;
          auVar51._24_4_ = fVar176 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar95 = vfmadd231ps_fma(auVar51,auVar107,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar113,ZEXT1632(auVar96));
          fVar167 = auVar94._0_4_;
          fVar175 = auVar94._4_4_;
          fVar176 = auVar94._8_4_;
          fVar177 = auVar94._12_4_;
          auVar103 = ZEXT1632(CONCAT412(auVar95._12_4_ * fVar177,
                                        CONCAT48(auVar95._8_4_ * fVar176,
                                                 CONCAT44(auVar95._4_4_ * fVar175,
                                                          auVar95._0_4_ * fVar167))));
          auVar188._4_4_ = fVar168;
          auVar188._0_4_ = fVar168;
          auVar188._8_4_ = fVar168;
          auVar188._12_4_ = fVar168;
          auVar188._16_4_ = fVar168;
          auVar188._20_4_ = fVar168;
          auVar188._24_4_ = fVar168;
          auVar188._28_4_ = fVar168;
          uVar147 = vcmpps_avx512vl(auVar188,auVar103,2);
          uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar28._4_4_ = uVar146;
          auVar28._0_4_ = uVar146;
          auVar28._8_4_ = uVar146;
          auVar28._12_4_ = uVar146;
          auVar28._16_4_ = uVar146;
          auVar28._20_4_ = uVar146;
          auVar28._24_4_ = uVar146;
          auVar28._28_4_ = uVar146;
          uVar25 = vcmpps_avx512vl(auVar103,auVar28,2);
          local_370 = (byte)uVar147 & (byte)uVar25 & local_370;
          if (local_370 != 0) {
            uVar147 = vcmpps_avx512vl(auVar104,auVar111,4);
            if ((local_370 & (byte)uVar147) != 0) {
              local_370 = local_370 & (byte)uVar147;
              fVar161 = auVar102._0_4_ * fVar167;
              fVar166 = auVar102._4_4_ * fVar175;
              auVar52._4_4_ = fVar166;
              auVar52._0_4_ = fVar161;
              fVar93 = auVar102._8_4_ * fVar176;
              auVar52._8_4_ = fVar93;
              fVar160 = auVar102._12_4_ * fVar177;
              auVar52._12_4_ = fVar160;
              fVar138 = auVar102._16_4_ * 0.0;
              auVar52._16_4_ = fVar138;
              fVar139 = auVar102._20_4_ * 0.0;
              auVar52._20_4_ = fVar139;
              fVar140 = auVar102._24_4_ * 0.0;
              auVar52._24_4_ = fVar140;
              auVar52._28_4_ = auVar102._28_4_;
              fVar167 = auVar110._0_4_ * fVar167;
              fVar175 = auVar110._4_4_ * fVar175;
              auVar53._4_4_ = fVar175;
              auVar53._0_4_ = fVar167;
              fVar176 = auVar110._8_4_ * fVar176;
              auVar53._8_4_ = fVar176;
              fVar177 = auVar110._12_4_ * fVar177;
              auVar53._12_4_ = fVar177;
              fVar141 = auVar110._16_4_ * 0.0;
              auVar53._16_4_ = fVar141;
              fVar142 = auVar110._20_4_ * 0.0;
              auVar53._20_4_ = fVar142;
              fVar143 = auVar110._24_4_ * 0.0;
              auVar53._24_4_ = fVar143;
              auVar53._28_4_ = auVar110._28_4_;
              auVar184._8_4_ = 0x3f800000;
              auVar184._0_8_ = &DAT_3f8000003f800000;
              auVar184._12_4_ = 0x3f800000;
              auVar184._16_4_ = 0x3f800000;
              auVar184._20_4_ = 0x3f800000;
              auVar184._24_4_ = 0x3f800000;
              auVar184._28_4_ = 0x3f800000;
              auVar104 = vsubps_avx(auVar184,auVar52);
              local_720._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar161 | (uint)!(bool)(bVar85 & 1) * auVar104._0_4_;
              bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
              local_720._4_4_ = (uint)bVar90 * (int)fVar166 | (uint)!bVar90 * auVar104._4_4_;
              bVar90 = (bool)((byte)(uVar83 >> 2) & 1);
              local_720._8_4_ = (uint)bVar90 * (int)fVar93 | (uint)!bVar90 * auVar104._8_4_;
              bVar90 = (bool)((byte)(uVar83 >> 3) & 1);
              local_720._12_4_ = (uint)bVar90 * (int)fVar160 | (uint)!bVar90 * auVar104._12_4_;
              bVar90 = (bool)((byte)(uVar83 >> 4) & 1);
              local_720._16_4_ = (uint)bVar90 * (int)fVar138 | (uint)!bVar90 * auVar104._16_4_;
              bVar90 = (bool)((byte)(uVar83 >> 5) & 1);
              local_720._20_4_ = (uint)bVar90 * (int)fVar139 | (uint)!bVar90 * auVar104._20_4_;
              bVar90 = (bool)((byte)(uVar83 >> 6) & 1);
              local_720._24_4_ = (uint)bVar90 * (int)fVar140 | (uint)!bVar90 * auVar104._24_4_;
              bVar90 = SUB81(uVar83 >> 7,0);
              local_720._28_4_ = (uint)bVar90 * auVar102._28_4_ | (uint)!bVar90 * auVar104._28_4_;
              auVar104 = vsubps_avx(auVar184,auVar53);
              bVar90 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar23 = SUB81(uVar83 >> 7,0);
              local_2e0._4_4_ = (uint)bVar90 * (int)fVar175 | (uint)!bVar90 * auVar104._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar167 | (uint)!(bool)(bVar85 & 1) * auVar104._0_4_;
              local_2e0._8_4_ = (uint)bVar18 * (int)fVar176 | (uint)!bVar18 * auVar104._8_4_;
              local_2e0._12_4_ = (uint)bVar19 * (int)fVar177 | (uint)!bVar19 * auVar104._12_4_;
              local_2e0._16_4_ = (uint)bVar20 * (int)fVar141 | (uint)!bVar20 * auVar104._16_4_;
              local_2e0._20_4_ = (uint)bVar21 * (int)fVar142 | (uint)!bVar21 * auVar104._20_4_;
              local_2e0._24_4_ = (uint)bVar22 * (int)fVar143 | (uint)!bVar22 * auVar104._24_4_;
              local_2e0._28_4_ = (uint)bVar23 * auVar110._28_4_ | (uint)!bVar23 * auVar104._28_4_;
              local_740 = auVar103;
              goto LAB_01e793e7;
            }
          }
          local_370 = 0;
        }
LAB_01e793e7:
        auVar212 = ZEXT3264(local_620);
        auVar211 = ZEXT3264(local_600);
        auVar210 = ZEXT3264(local_5e0);
        auVar204 = ZEXT3264(auVar109);
        if (local_370 != 0) {
          auVar104 = vsubps_avx(ZEXT1632(auVar11),auVar100);
          auVar94 = vfmadd213ps_fma(auVar104,local_720,auVar100);
          uVar146 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar29._4_4_ = uVar146;
          auVar29._0_4_ = uVar146;
          auVar29._8_4_ = uVar146;
          auVar29._12_4_ = uVar146;
          auVar29._16_4_ = uVar146;
          auVar29._20_4_ = uVar146;
          auVar29._24_4_ = uVar146;
          auVar29._28_4_ = uVar146;
          auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar29)
          ;
          uVar147 = vcmpps_avx512vl(local_740,auVar104,6);
          local_370 = local_370 & (byte)uVar147;
          if (local_370 != 0) {
            auVar153._8_4_ = 0xbf800000;
            auVar153._0_8_ = 0xbf800000bf800000;
            auVar153._12_4_ = 0xbf800000;
            auVar153._16_4_ = 0xbf800000;
            auVar153._20_4_ = 0xbf800000;
            auVar153._24_4_ = 0xbf800000;
            auVar153._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_400 = vfmadd132ps_avx512vl(local_2e0,auVar153,auVar30);
            local_2e0 = local_400;
            auVar104 = local_2e0;
            local_3c0 = 0;
            local_3b0 = local_750._0_8_;
            uStack_3a8 = local_750._8_8_;
            local_3a0 = local_510._0_8_;
            uStack_398 = local_510._8_8_;
            local_390 = local_520._0_8_;
            uStack_388 = local_520._8_8_;
            local_380 = local_530._0_8_;
            uStack_378 = local_530._8_8_;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar90 = true, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar145 = 1.0 / auVar191._0_4_;
                local_360[0] = fVar145 * (local_720._0_4_ + 0.0);
                local_360[1] = fVar145 * (local_720._4_4_ + 1.0);
                local_360[2] = fVar145 * (local_720._8_4_ + 2.0);
                local_360[3] = fVar145 * (local_720._12_4_ + 3.0);
                fStack_350 = fVar145 * (local_720._16_4_ + 4.0);
                fStack_34c = fVar145 * (local_720._20_4_ + 5.0);
                fStack_348 = fVar145 * (local_720._24_4_ + 6.0);
                fStack_344 = local_720._28_4_ + 7.0;
                local_2e0._0_8_ = local_400._0_8_;
                local_2e0._8_8_ = local_400._8_8_;
                local_2e0._16_8_ = local_400._16_8_;
                local_2e0._24_8_ = local_400._24_8_;
                local_340 = local_2e0._0_8_;
                uStack_338 = local_2e0._8_8_;
                uStack_330 = local_2e0._16_8_;
                uStack_328 = local_2e0._24_8_;
                local_320 = local_740;
                local_4a0 = 0;
                uVar89 = (ulong)local_370;
                for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  local_4a0 = local_4a0 + 1;
                }
                local_4c0 = vpbroadcastd_avx512vl();
                local_760 = local_510._0_4_;
                uStack_75c = local_510._4_4_;
                uStack_758 = local_510._8_8_;
                local_4e0 = vpbroadcastd_avx512vl();
                local_6a0 = local_520._0_8_;
                uStack_698 = local_520._8_8_;
                local_6b0 = local_530._0_4_;
                fStack_6ac = local_530._4_4_;
                fStack_6a8 = local_530._8_4_;
                fStack_6a4 = local_530._12_4_;
                bVar90 = true;
                local_640 = fVar168;
                local_5c0 = auVar109;
                local_420 = local_720;
                local_3e0 = local_740;
                local_3bc = iVar13;
                local_2e0 = auVar104;
                do {
                  auVar96 = auVar209._0_16_;
                  uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_240 = local_360[local_4a0];
                  local_220 = *(undefined4 *)((long)&local_340 + local_4a0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + local_4a0 * 4);
                  local_7a0.context = context->user;
                  fVar167 = 1.0 - local_240;
                  fVar145 = fVar167 * fVar167 * -3.0;
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),
                                            ZEXT416((uint)(local_240 * fVar167)),ZEXT416(0xc0000000)
                                           );
                  auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar167)),
                                            ZEXT416((uint)(local_240 * local_240)),
                                            ZEXT416(0x40000000));
                  fVar167 = auVar94._0_4_ * 3.0;
                  fVar175 = auVar95._0_4_ * 3.0;
                  fVar176 = local_240 * local_240 * 3.0;
                  auVar178._0_4_ = fVar176 * local_6b0;
                  auVar178._4_4_ = fVar176 * fStack_6ac;
                  auVar178._8_4_ = fVar176 * fStack_6a8;
                  auVar178._12_4_ = fVar176 * fStack_6a4;
                  auVar148._4_4_ = fVar175;
                  auVar148._0_4_ = fVar175;
                  auVar148._8_4_ = fVar175;
                  auVar148._12_4_ = fVar175;
                  auVar79._8_8_ = uStack_698;
                  auVar79._0_8_ = local_6a0;
                  auVar94 = vfmadd132ps_fma(auVar148,auVar178,auVar79);
                  auVar162._4_4_ = fVar167;
                  auVar162._0_4_ = fVar167;
                  auVar162._8_4_ = fVar167;
                  auVar162._12_4_ = fVar167;
                  auVar73._4_4_ = uStack_75c;
                  auVar73._0_4_ = local_760;
                  auVar73._8_8_ = uStack_758;
                  auVar94 = vfmadd132ps_fma(auVar162,auVar94,auVar73);
                  auVar149._4_4_ = fVar145;
                  auVar149._0_4_ = fVar145;
                  auVar149._8_4_ = fVar145;
                  auVar149._12_4_ = fVar145;
                  auVar94 = vfmadd132ps_fma(auVar149,auVar94,local_750);
                  local_2a0 = auVar94._0_4_;
                  auVar171._8_4_ = 1;
                  auVar171._0_8_ = 0x100000001;
                  auVar171._12_4_ = 1;
                  auVar171._16_4_ = 1;
                  auVar171._20_4_ = 1;
                  auVar171._24_4_ = 1;
                  auVar171._28_4_ = 1;
                  local_280 = vpermps_avx2(auVar171,ZEXT1632(auVar94));
                  auVar181._8_4_ = 2;
                  auVar181._0_8_ = 0x200000002;
                  auVar181._12_4_ = 2;
                  auVar181._16_4_ = 2;
                  auVar181._20_4_ = 2;
                  auVar181._24_4_ = 2;
                  auVar181._28_4_ = 2;
                  local_260 = vpermps_avx2(auVar181,ZEXT1632(auVar94));
                  uStack_29c = local_2a0;
                  uStack_298 = local_2a0;
                  uStack_294 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_28c = local_2a0;
                  uStack_288 = local_2a0;
                  uStack_284 = local_2a0;
                  fStack_23c = local_240;
                  fStack_238 = local_240;
                  fStack_234 = local_240;
                  fStack_230 = local_240;
                  fStack_22c = local_240;
                  fStack_228 = local_240;
                  fStack_224 = local_240;
                  uStack_21c = local_220;
                  uStack_218 = local_220;
                  uStack_214 = local_220;
                  uStack_210 = local_220;
                  uStack_20c = local_220;
                  uStack_208 = local_220;
                  uStack_204 = local_220;
                  local_200 = local_4e0._0_8_;
                  uStack_1f8 = local_4e0._8_8_;
                  uStack_1f0 = local_4e0._16_8_;
                  uStack_1e8 = local_4e0._24_8_;
                  local_1e0 = local_4c0;
                  vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_1c0 = (local_7a0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_7a0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_6e0 = local_2c0._0_8_;
                  uStack_6d8 = local_2c0._8_8_;
                  uStack_6d0 = local_2c0._16_8_;
                  uStack_6c8 = local_2c0._24_8_;
                  local_7a0.valid = (int *)&local_6e0;
                  local_7a0.geometryUserPtr = pGVar14->userPtr;
                  local_7a0.hit = (RTCHitN *)&local_2a0;
                  local_7a0.N = 8;
                  local_480 = (undefined4)uVar89;
                  uStack_47c = (undefined4)(uVar89 >> 0x20);
                  local_7a0.ray = (RTCRayN *)ray;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_7a0);
                    uVar89 = CONCAT44(uStack_47c,local_480);
                    auVar199 = ZEXT1664(_local_770);
                    auVar204 = ZEXT3264(local_5c0);
                    auVar212 = ZEXT3264(local_620);
                    auVar211 = ZEXT3264(local_600);
                    auVar210 = ZEXT3264(local_5e0);
                    auVar213 = ZEXT3264(local_700);
                    auVar205 = ZEXT3264(local_5a0);
                    auVar208 = ZEXT3264(local_580);
                    auVar207 = ZEXT3264(local_500);
                    auVar206 = ZEXT3264(local_560);
                    auVar94 = vxorps_avx512vl(auVar96,auVar96);
                    auVar209 = ZEXT1664(auVar94);
                    fVar168 = local_640;
                  }
                  auVar94 = auVar209._0_16_;
                  auVar74._8_8_ = uStack_6d8;
                  auVar74._0_8_ = local_6e0;
                  auVar74._16_8_ = uStack_6d0;
                  auVar74._24_8_ = uStack_6c8;
                  if (auVar74 != (undefined1  [32])0x0) {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var17)(&local_7a0);
                      uVar89 = CONCAT44(uStack_47c,local_480);
                      auVar199 = ZEXT1664(_local_770);
                      auVar204 = ZEXT3264(local_5c0);
                      auVar212 = ZEXT3264(local_620);
                      auVar211 = ZEXT3264(local_600);
                      auVar210 = ZEXT3264(local_5e0);
                      auVar213 = ZEXT3264(local_700);
                      auVar205 = ZEXT3264(local_5a0);
                      auVar208 = ZEXT3264(local_580);
                      auVar207 = ZEXT3264(local_500);
                      auVar206 = ZEXT3264(local_560);
                      auVar94 = vxorps_avx512vl(auVar94,auVar94);
                      auVar209 = ZEXT1664(auVar94);
                      fVar168 = local_640;
                    }
                    auVar109 = auVar204._0_32_;
                    auVar75._8_8_ = uStack_6d8;
                    auVar75._0_8_ = local_6e0;
                    auVar75._16_8_ = uStack_6d0;
                    auVar75._24_8_ = uStack_6c8;
                    uVar83 = vptestmd_avx512vl(auVar75,auVar75);
                    auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar18 = (bool)((byte)uVar83 & 1);
                    auVar126._0_4_ =
                         (uint)bVar18 * auVar104._0_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x100);
                    bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
                    auVar126._4_4_ =
                         (uint)bVar18 * auVar104._4_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x104);
                    bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                    auVar126._8_4_ =
                         (uint)bVar18 * auVar104._8_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x108);
                    bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                    auVar126._12_4_ =
                         (uint)bVar18 * auVar104._12_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x10c);
                    bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
                    auVar126._16_4_ =
                         (uint)bVar18 * auVar104._16_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x110);
                    bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
                    auVar126._20_4_ =
                         (uint)bVar18 * auVar104._20_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x114);
                    bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                    auVar126._24_4_ =
                         (uint)bVar18 * auVar104._24_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x118);
                    bVar18 = SUB81(uVar83 >> 7,0);
                    auVar126._28_4_ =
                         (uint)bVar18 * auVar104._28_4_ |
                         (uint)!bVar18 * *(int *)(local_7a0.ray + 0x11c);
                    *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar126;
                    fVar145 = auVar199._0_4_;
                    if (auVar75 != (undefined1  [32])0x0) break;
                  }
                  auVar109 = auVar204._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar146;
                  uVar83 = local_4a0 & 0x3f;
                  local_4a0 = 0;
                  uVar89 = uVar89 ^ 1L << uVar83;
                  for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000
                      ) {
                    local_4a0 = local_4a0 + 1;
                  }
                  bVar90 = uVar89 != 0;
                  fVar145 = auVar199._0_4_;
                } while (bVar90);
              }
              goto LAB_01e799d8;
            }
          }
        }
        bVar90 = false;
      }
LAB_01e799d8:
      local_640 = fVar145;
      if (8 < iVar13) {
        auVar104 = vpbroadcastd_avx512vl();
        auVar199 = ZEXT3264(auVar104);
        fStack_498 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar92 = 8;
        fStack_63c = local_640;
        fStack_638 = local_640;
        fStack_634 = local_640;
        fStack_630 = local_640;
        fStack_62c = local_640;
        fStack_628 = local_640;
        fStack_624 = local_640;
        local_5c0 = auVar109;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_480 = fVar168;
        uStack_47c = fVar168;
        uStack_478 = fVar168;
        uStack_474 = fVar168;
        uStack_470 = fVar168;
        uStack_46c = fVar168;
        uStack_468 = fVar168;
        uStack_464 = fVar168;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar104 = vpbroadcastd_avx512vl();
          auVar105 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar25 = vpcmpgtd_avx512vl(auVar199._0_32_,auVar105);
          auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 * 4 + lVar26);
          auVar103 = *(undefined1 (*) [32])(lVar26 + 0x2227768 + lVar92 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2227bec + lVar92 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar26 + 0x2228070 + lVar92 * 4);
          local_600 = auVar211._0_32_;
          auVar106 = vmulps_avx512vl(local_600,auVar114);
          local_620 = auVar212._0_32_;
          auVar113 = vmulps_avx512vl(local_620,auVar114);
          auVar54._4_4_ = auVar114._4_4_ * (float)local_100._4_4_;
          auVar54._0_4_ = auVar114._0_4_ * (float)local_100._0_4_;
          auVar54._8_4_ = auVar114._8_4_ * fStack_f8;
          auVar54._12_4_ = auVar114._12_4_ * fStack_f4;
          auVar54._16_4_ = auVar114._16_4_ * fStack_f0;
          auVar54._20_4_ = auVar114._20_4_ * fStack_ec;
          auVar54._24_4_ = auVar114._24_4_ * fStack_e8;
          auVar54._28_4_ = auVar105._28_4_;
          auVar183 = auVar213._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar106,auVar115,auVar183);
          local_5e0 = auVar210._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar113,auVar115,local_5e0);
          auVar113 = vfmadd231ps_avx512vl(auVar54,auVar115,local_e0);
          auVar180 = auVar208._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar180);
          auVar156 = auVar205._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar156);
          auVar94 = vfmadd231ps_fma(auVar113,auVar103,local_c0);
          auVar159 = auVar206._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar159);
          local_500 = auVar207._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar106,auVar104,local_500);
          auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 * 4 + lVar26);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x2229b88 + lVar92 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,local_a0);
          auVar113 = *(undefined1 (*) [32])(lVar26 + 0x222a00c + lVar92 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x222a490 + lVar92 * 4);
          auVar109 = vmulps_avx512vl(local_600,auVar107);
          auVar108 = vmulps_avx512vl(local_620,auVar107);
          auVar55._4_4_ = auVar107._4_4_ * (float)local_100._4_4_;
          auVar55._0_4_ = auVar107._0_4_ * (float)local_100._0_4_;
          auVar55._8_4_ = auVar107._8_4_ * fStack_f8;
          auVar55._12_4_ = auVar107._12_4_ * fStack_f4;
          auVar55._16_4_ = auVar107._16_4_ * fStack_f0;
          auVar55._20_4_ = auVar107._20_4_ * fStack_ec;
          auVar55._24_4_ = auVar107._24_4_ * fStack_e8;
          auVar55._28_4_ = uStack_e4;
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar113,auVar183);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_5e0);
          auVar111 = vfmadd231ps_avx512vl(auVar55,auVar113,local_e0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar180);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar156);
          auVar95 = vfmadd231ps_fma(auVar111,auVar106,local_c0);
          auVar111 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar159);
          auVar100 = vfmadd231ps_avx512vl(auVar108,auVar105,local_500);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar105,local_a0);
          auVar101 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar95));
          auVar109 = vsubps_avx(auVar111,auVar102);
          auVar108 = vsubps_avx(auVar100,auVar110);
          auVar112 = vmulps_avx512vl(auVar110,auVar109);
          auVar127 = vmulps_avx512vl(auVar102,auVar108);
          auVar112 = vsubps_avx512vl(auVar112,auVar127);
          auVar127 = vmulps_avx512vl(auVar108,auVar108);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar109,auVar109);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          auVar101 = vmulps_avx512vl(auVar101,auVar127);
          auVar112 = vmulps_avx512vl(auVar112,auVar112);
          uVar147 = vcmpps_avx512vl(auVar112,auVar101,2);
          local_370 = (byte)uVar25 & (byte)uVar147;
          if (local_370 == 0) {
            auVar204 = ZEXT3264(auVar156);
            auVar213 = ZEXT3264(auVar183);
          }
          else {
            auVar107 = vmulps_avx512vl(local_5c0,auVar107);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar107);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_140,auVar113);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_120,auVar106);
            auVar114 = vmulps_avx512vl(local_5c0,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar114);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_140,auVar115);
            auVar106 = vfmadd213ps_avx512vl(auVar104,local_120,auVar103);
            auVar104 = *(undefined1 (*) [32])(lVar26 + 0x22284f4 + lVar92 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar26 + 0x2228978 + lVar92 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2228dfc + lVar92 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar26 + 0x2229280 + lVar92 * 4);
            auVar113 = vmulps_avx512vl(local_600,auVar114);
            auVar107 = vmulps_avx512vl(local_620,auVar114);
            auVar114 = vmulps_avx512vl(local_5c0,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar183);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_5e0);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_160,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar180);
            auVar113 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar156);
            auVar103 = vfmadd231ps_avx512vl(auVar115,local_140,auVar103);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar104,auVar159);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,local_500);
            auVar107 = vfmadd231ps_avx512vl(auVar103,local_120,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar26 + 0x222a914 + lVar92 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar26 + 0x222b21c + lVar92 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x222b6a0 + lVar92 * 4);
            auVar101 = vmulps_avx512vl(local_600,auVar115);
            auVar112 = vmulps_avx512vl(local_620,auVar115);
            auVar115 = vmulps_avx512vl(local_5c0,auVar115);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar183);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,local_5e0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar26 + 0x222ad98 + lVar92 * 4);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar180);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar156);
            auVar103 = vfmadd231ps_avx512vl(auVar115,local_140,auVar103);
            auVar115 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar159);
            auVar101 = vfmadd231ps_avx512vl(auVar112,auVar104,local_500);
            auVar103 = vfmadd231ps_avx512vl(auVar103,local_120,auVar104);
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar112);
            vandps_avx512vl(auVar113,auVar112);
            auVar104 = vmaxps_avx(auVar112,auVar112);
            vandps_avx512vl(auVar107,auVar112);
            auVar104 = vmaxps_avx(auVar104,auVar112);
            auVar81._4_4_ = fStack_63c;
            auVar81._0_4_ = local_640;
            auVar81._8_4_ = fStack_638;
            auVar81._12_4_ = fStack_634;
            auVar81._16_4_ = fStack_630;
            auVar81._20_4_ = fStack_62c;
            auVar81._24_4_ = fStack_628;
            auVar81._28_4_ = fStack_624;
            uVar83 = vcmpps_avx512vl(auVar104,auVar81,1);
            bVar18 = (bool)((byte)uVar83 & 1);
            auVar128._0_4_ = (float)((uint)bVar18 * auVar109._0_4_ | (uint)!bVar18 * auVar114._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar114._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar114._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar114._12_4_);
            bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * auVar114._16_4_);
            bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * auVar114._20_4_);
            bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * auVar114._24_4_);
            bVar18 = SUB81(uVar83 >> 7,0);
            auVar128._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar114._28_4_;
            bVar18 = (bool)((byte)uVar83 & 1);
            auVar129._0_4_ = (float)((uint)bVar18 * auVar108._0_4_ | (uint)!bVar18 * auVar113._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar113._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar113._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar113._12_4_);
            bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar18 * auVar108._16_4_ | (uint)!bVar18 * auVar113._16_4_);
            bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar18 * auVar108._20_4_ | (uint)!bVar18 * auVar113._20_4_);
            bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar18 * auVar108._24_4_ | (uint)!bVar18 * auVar113._24_4_);
            bVar18 = SUB81(uVar83 >> 7,0);
            auVar129._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar113._28_4_;
            vandps_avx512vl(auVar115,auVar112);
            vandps_avx512vl(auVar101,auVar112);
            auVar104 = vmaxps_avx(auVar129,auVar129);
            vandps_avx512vl(auVar103,auVar112);
            auVar104 = vmaxps_avx(auVar104,auVar129);
            uVar83 = vcmpps_avx512vl(auVar104,auVar81,1);
            bVar18 = (bool)((byte)uVar83 & 1);
            auVar130._0_4_ = (uint)bVar18 * auVar109._0_4_ | (uint)!bVar18 * auVar115._0_4_;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar115._4_4_;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar115._8_4_;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar115._12_4_;
            bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar130._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * auVar115._16_4_;
            bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar130._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * auVar115._20_4_;
            bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar130._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * auVar115._24_4_;
            bVar18 = SUB81(uVar83 >> 7,0);
            auVar130._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar115._28_4_;
            bVar18 = (bool)((byte)uVar83 & 1);
            auVar131._0_4_ = (float)((uint)bVar18 * auVar108._0_4_ | (uint)!bVar18 * auVar101._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar101._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar101._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar101._12_4_);
            bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar18 * auVar108._16_4_ | (uint)!bVar18 * auVar101._16_4_);
            bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar18 * auVar108._20_4_ | (uint)!bVar18 * auVar101._20_4_);
            bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar18 * auVar108._24_4_ | (uint)!bVar18 * auVar101._24_4_);
            bVar18 = SUB81(uVar83 >> 7,0);
            auVar131._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar101._28_4_;
            auVar193._8_4_ = 0x80000000;
            auVar193._0_8_ = 0x8000000080000000;
            auVar193._12_4_ = 0x80000000;
            auVar193._16_4_ = 0x80000000;
            auVar193._20_4_ = 0x80000000;
            auVar193._24_4_ = 0x80000000;
            auVar193._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar130,auVar193);
            auVar101 = auVar209._0_32_;
            auVar103 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar101);
            auVar96 = vfmadd231ps_fma(auVar103,auVar129,auVar129);
            auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
            auVar203._8_4_ = 0xbf000000;
            auVar203._0_8_ = 0xbf000000bf000000;
            auVar203._12_4_ = 0xbf000000;
            auVar203._16_4_ = 0xbf000000;
            auVar203._20_4_ = 0xbf000000;
            auVar203._24_4_ = 0xbf000000;
            auVar203._28_4_ = 0xbf000000;
            fVar168 = auVar103._0_4_;
            fVar145 = auVar103._4_4_;
            fVar167 = auVar103._8_4_;
            fVar175 = auVar103._12_4_;
            fVar176 = auVar103._16_4_;
            fVar177 = auVar103._20_4_;
            fVar161 = auVar103._24_4_;
            auVar56._4_4_ = fVar145 * fVar145 * fVar145 * auVar96._4_4_ * -0.5;
            auVar56._0_4_ = fVar168 * fVar168 * fVar168 * auVar96._0_4_ * -0.5;
            auVar56._8_4_ = fVar167 * fVar167 * fVar167 * auVar96._8_4_ * -0.5;
            auVar56._12_4_ = fVar175 * fVar175 * fVar175 * auVar96._12_4_ * -0.5;
            auVar56._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar56._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar56._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar56._28_4_ = auVar129._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar103 = vfmadd231ps_avx512vl(auVar56,auVar115,auVar103);
            auVar57._4_4_ = auVar129._4_4_ * auVar103._4_4_;
            auVar57._0_4_ = auVar129._0_4_ * auVar103._0_4_;
            auVar57._8_4_ = auVar129._8_4_ * auVar103._8_4_;
            auVar57._12_4_ = auVar129._12_4_ * auVar103._12_4_;
            auVar57._16_4_ = auVar129._16_4_ * auVar103._16_4_;
            auVar57._20_4_ = auVar129._20_4_ * auVar103._20_4_;
            auVar57._24_4_ = auVar129._24_4_ * auVar103._24_4_;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = auVar103._4_4_ * -auVar128._4_4_;
            auVar58._0_4_ = auVar103._0_4_ * -auVar128._0_4_;
            auVar58._8_4_ = auVar103._8_4_ * -auVar128._8_4_;
            auVar58._12_4_ = auVar103._12_4_ * -auVar128._12_4_;
            auVar58._16_4_ = auVar103._16_4_ * -auVar128._16_4_;
            auVar58._20_4_ = auVar103._20_4_ * -auVar128._20_4_;
            auVar58._24_4_ = auVar103._24_4_ * -auVar128._24_4_;
            auVar58._28_4_ = auVar129._28_4_;
            auVar114 = vmulps_avx512vl(auVar103,auVar101);
            auVar103 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar101);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar131,auVar131);
            auVar113 = vrsqrt14ps_avx512vl(auVar103);
            auVar103 = vmulps_avx512vl(auVar103,auVar203);
            fVar168 = auVar113._0_4_;
            fVar145 = auVar113._4_4_;
            fVar167 = auVar113._8_4_;
            fVar175 = auVar113._12_4_;
            fVar176 = auVar113._16_4_;
            fVar177 = auVar113._20_4_;
            fVar161 = auVar113._24_4_;
            auVar59._4_4_ = fVar145 * fVar145 * fVar145 * auVar103._4_4_;
            auVar59._0_4_ = fVar168 * fVar168 * fVar168 * auVar103._0_4_;
            auVar59._8_4_ = fVar167 * fVar167 * fVar167 * auVar103._8_4_;
            auVar59._12_4_ = fVar175 * fVar175 * fVar175 * auVar103._12_4_;
            auVar59._16_4_ = fVar176 * fVar176 * fVar176 * auVar103._16_4_;
            auVar59._20_4_ = fVar177 * fVar177 * fVar177 * auVar103._20_4_;
            auVar59._24_4_ = fVar161 * fVar161 * fVar161 * auVar103._24_4_;
            auVar59._28_4_ = auVar103._28_4_;
            auVar103 = vfmadd231ps_avx512vl(auVar59,auVar115,auVar113);
            auVar60._4_4_ = auVar131._4_4_ * auVar103._4_4_;
            auVar60._0_4_ = auVar131._0_4_ * auVar103._0_4_;
            auVar60._8_4_ = auVar131._8_4_ * auVar103._8_4_;
            auVar60._12_4_ = auVar131._12_4_ * auVar103._12_4_;
            auVar60._16_4_ = auVar131._16_4_ * auVar103._16_4_;
            auVar60._20_4_ = auVar131._20_4_ * auVar103._20_4_;
            auVar60._24_4_ = auVar131._24_4_ * auVar103._24_4_;
            auVar60._28_4_ = auVar113._28_4_;
            auVar61._4_4_ = auVar103._4_4_ * auVar104._4_4_;
            auVar61._0_4_ = auVar103._0_4_ * auVar104._0_4_;
            auVar61._8_4_ = auVar103._8_4_ * auVar104._8_4_;
            auVar61._12_4_ = auVar103._12_4_ * auVar104._12_4_;
            auVar61._16_4_ = auVar103._16_4_ * auVar104._16_4_;
            auVar61._20_4_ = auVar103._20_4_ * auVar104._20_4_;
            auVar61._24_4_ = auVar103._24_4_ * auVar104._24_4_;
            auVar61._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar103,auVar101);
            auVar96 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar94),auVar102);
            auVar103 = ZEXT1632(auVar94);
            auVar6 = vfmadd213ps_fma(auVar58,auVar103,auVar110);
            auVar115 = vfmadd213ps_avx512vl(auVar114,auVar103,auVar106);
            auVar113 = vfmadd213ps_avx512vl(auVar60,ZEXT1632(auVar95),auVar111);
            auVar11 = vfnmadd213ps_fma(auVar57,auVar103,auVar102);
            auVar107 = ZEXT1632(auVar95);
            auVar7 = vfmadd213ps_fma(auVar61,auVar107,auVar100);
            auVar97 = vfnmadd213ps_fma(auVar58,auVar103,auVar110);
            auVar8 = vfmadd213ps_fma(auVar104,auVar107,auVar105);
            auVar110 = ZEXT1632(auVar94);
            auVar99 = vfnmadd231ps_fma(auVar106,auVar110,auVar114);
            auVar98 = vfnmadd213ps_fma(auVar60,auVar107,auVar111);
            auVar155 = vfnmadd213ps_fma(auVar61,auVar107,auVar100);
            auVar157 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar95),auVar104);
            auVar105 = vsubps_avx512vl(auVar113,ZEXT1632(auVar11));
            auVar104 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar97));
            auVar103 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar99));
            auVar62._4_4_ = auVar104._4_4_ * auVar99._4_4_;
            auVar62._0_4_ = auVar104._0_4_ * auVar99._0_4_;
            auVar62._8_4_ = auVar104._8_4_ * auVar99._8_4_;
            auVar62._12_4_ = auVar104._12_4_ * auVar99._12_4_;
            auVar62._16_4_ = auVar104._16_4_ * 0.0;
            auVar62._20_4_ = auVar104._20_4_ * 0.0;
            auVar62._24_4_ = auVar104._24_4_ * 0.0;
            auVar62._28_4_ = auVar114._28_4_;
            auVar94 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar97),auVar103);
            auVar63._4_4_ = auVar103._4_4_ * auVar11._4_4_;
            auVar63._0_4_ = auVar103._0_4_ * auVar11._0_4_;
            auVar63._8_4_ = auVar103._8_4_ * auVar11._8_4_;
            auVar63._12_4_ = auVar103._12_4_ * auVar11._12_4_;
            auVar63._16_4_ = auVar103._16_4_ * 0.0;
            auVar63._20_4_ = auVar103._20_4_ * 0.0;
            auVar63._24_4_ = auVar103._24_4_ * 0.0;
            auVar63._28_4_ = auVar103._28_4_;
            auVar9 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar99),auVar105);
            auVar64._4_4_ = auVar97._4_4_ * auVar105._4_4_;
            auVar64._0_4_ = auVar97._0_4_ * auVar105._0_4_;
            auVar64._8_4_ = auVar97._8_4_ * auVar105._8_4_;
            auVar64._12_4_ = auVar97._12_4_ * auVar105._12_4_;
            auVar64._16_4_ = auVar105._16_4_ * 0.0;
            auVar64._20_4_ = auVar105._20_4_ * 0.0;
            auVar64._24_4_ = auVar105._24_4_ * 0.0;
            auVar64._28_4_ = auVar105._28_4_;
            auVar10 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar11),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar101,ZEXT1632(auVar9));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,ZEXT1632(auVar94));
            uVar83 = vcmpps_avx512vl(auVar104,auVar101,2);
            bVar85 = (byte)uVar83;
            fVar160 = (float)((uint)(bVar85 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar98._0_4_);
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar139 = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar98._4_4_);
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar141 = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar98._8_4_);
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar143 = (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar98._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar160))));
            fVar138 = (float)((uint)(bVar85 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar155._0_4_);
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar140 = (float)((uint)bVar18 * auVar6._4_4_ | (uint)!bVar18 * auVar155._4_4_);
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar142 = (float)((uint)bVar18 * auVar6._8_4_ | (uint)!bVar18 * auVar155._8_4_);
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar144 = (float)((uint)bVar18 * auVar6._12_4_ | (uint)!bVar18 * auVar155._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
            auVar132._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar157._0_4_);
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar157._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar157._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar157._12_4_);
            fVar168 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
            auVar132._16_4_ = fVar168;
            fVar145 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
            auVar132._20_4_ = fVar145;
            fVar167 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
            auVar132._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
            auVar132._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar113);
            auVar133._0_4_ =
                 (uint)(bVar85 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar94._0_4_;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar94._4_4_;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar94._8_4_;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar94._12_4_;
            auVar133._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_;
            auVar133._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_;
            auVar133._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_;
            auVar133._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar7));
            auVar134._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar96._0_4_);
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar96._4_4_);
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar96._8_4_);
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar96._12_4_);
            fVar177 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_);
            auVar134._16_4_ = fVar177;
            fVar176 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_);
            auVar134._20_4_ = fVar176;
            fVar175 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_);
            auVar134._24_4_ = fVar175;
            auVar134._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar8));
            auVar135._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar6._0_4_);
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar6._4_4_);
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar6._8_4_);
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar6._12_4_);
            fVar93 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_);
            auVar135._16_4_ = fVar93;
            fVar166 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_);
            auVar135._20_4_ = fVar166;
            fVar161 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_);
            auVar135._24_4_ = fVar161;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar135._28_4_ = iVar2;
            auVar136._0_4_ =
                 (uint)(bVar85 & 1) * (int)auVar11._0_4_ |
                 (uint)!(bool)(bVar85 & 1) * auVar113._0_4_;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar18 * (int)auVar11._4_4_ | (uint)!bVar18 * auVar113._4_4_;
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar18 * (int)auVar11._8_4_ | (uint)!bVar18 * auVar113._8_4_;
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar18 * (int)auVar11._12_4_ | (uint)!bVar18 * auVar113._12_4_;
            auVar136._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar113._16_4_;
            auVar136._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar113._20_4_;
            auVar136._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar113._24_4_;
            auVar136._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar113._28_4_;
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar113 = vsubps_avx512vl(auVar136,auVar107);
            auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar97._12_4_ |
                                                     (uint)!bVar22 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar97._8_4_ |
                                                              (uint)!bVar20 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar18 * auVar7._4_4_,
                                                                       (uint)(bVar85 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar85 & 1) *
                                                                       auVar7._0_4_)))),auVar109);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar99._12_4_ |
                                                     (uint)!bVar23 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar21 * (int)auVar99._8_4_ |
                                                              (uint)!bVar21 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar19 *
                                                                       (int)auVar99._4_4_ |
                                                                       (uint)!bVar19 * auVar8._4_4_,
                                                                       (uint)(bVar85 & 1) *
                                                                       (int)auVar99._0_4_ |
                                                                       (uint)!(bool)(bVar85 & 1) *
                                                                       auVar8._0_4_)))),auVar132);
            auVar114 = vsubps_avx(auVar107,auVar133);
            auVar105 = vsubps_avx(auVar109,auVar134);
            auVar106 = vsubps_avx(auVar132,auVar135);
            auVar65._4_4_ = auVar115._4_4_ * fVar139;
            auVar65._0_4_ = auVar115._0_4_ * fVar160;
            auVar65._8_4_ = auVar115._8_4_ * fVar141;
            auVar65._12_4_ = auVar115._12_4_ * fVar143;
            auVar65._16_4_ = auVar115._16_4_ * 0.0;
            auVar65._20_4_ = auVar115._20_4_ * 0.0;
            auVar65._24_4_ = auVar115._24_4_ * 0.0;
            auVar65._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar65,auVar132,auVar113);
            auVar165._0_4_ = fVar138 * auVar113._0_4_;
            auVar165._4_4_ = fVar140 * auVar113._4_4_;
            auVar165._8_4_ = fVar142 * auVar113._8_4_;
            auVar165._12_4_ = fVar144 * auVar113._12_4_;
            auVar165._16_4_ = auVar113._16_4_ * 0.0;
            auVar165._20_4_ = auVar113._20_4_ * 0.0;
            auVar165._24_4_ = auVar113._24_4_ * 0.0;
            auVar165._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar165,auVar107,auVar103);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar101,ZEXT1632(auVar94));
            auVar172._0_4_ = auVar103._0_4_ * auVar132._0_4_;
            auVar172._4_4_ = auVar103._4_4_ * auVar132._4_4_;
            auVar172._8_4_ = auVar103._8_4_ * auVar132._8_4_;
            auVar172._12_4_ = auVar103._12_4_ * auVar132._12_4_;
            auVar172._16_4_ = auVar103._16_4_ * fVar168;
            auVar172._20_4_ = auVar103._20_4_ * fVar145;
            auVar172._24_4_ = auVar103._24_4_ * fVar167;
            auVar172._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar172,auVar109,auVar115);
            auVar108 = vfmadd231ps_avx512vl(auVar104,auVar101,ZEXT1632(auVar94));
            auVar104 = vmulps_avx512vl(auVar106,auVar133);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar135);
            auVar66._4_4_ = auVar105._4_4_ * auVar135._4_4_;
            auVar66._0_4_ = auVar105._0_4_ * auVar135._0_4_;
            auVar66._8_4_ = auVar105._8_4_ * auVar135._8_4_;
            auVar66._12_4_ = auVar105._12_4_ * auVar135._12_4_;
            auVar66._16_4_ = auVar105._16_4_ * fVar93;
            auVar66._20_4_ = auVar105._20_4_ * fVar166;
            auVar66._24_4_ = auVar105._24_4_ * fVar161;
            auVar66._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar66,auVar134,auVar106);
            auVar173._0_4_ = auVar134._0_4_ * auVar114._0_4_;
            auVar173._4_4_ = auVar134._4_4_ * auVar114._4_4_;
            auVar173._8_4_ = auVar134._8_4_ * auVar114._8_4_;
            auVar173._12_4_ = auVar134._12_4_ * auVar114._12_4_;
            auVar173._16_4_ = fVar177 * auVar114._16_4_;
            auVar173._20_4_ = fVar176 * auVar114._20_4_;
            auVar173._24_4_ = fVar175 * auVar114._24_4_;
            auVar173._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar173,auVar105,auVar133);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar101,auVar104);
            auVar102 = vfmadd231ps_avx512vl(auVar104,auVar101,ZEXT1632(auVar94));
            auVar104 = vmaxps_avx(auVar108,auVar102);
            uVar147 = vcmpps_avx512vl(auVar104,auVar101,2);
            local_370 = local_370 & (byte)uVar147;
            auVar204 = ZEXT3264(auVar156);
            if (local_370 == 0) {
LAB_01e7a5cc:
              local_370 = 0;
            }
            else {
              auVar67._4_4_ = auVar106._4_4_ * auVar103._4_4_;
              auVar67._0_4_ = auVar106._0_4_ * auVar103._0_4_;
              auVar67._8_4_ = auVar106._8_4_ * auVar103._8_4_;
              auVar67._12_4_ = auVar106._12_4_ * auVar103._12_4_;
              auVar67._16_4_ = auVar106._16_4_ * auVar103._16_4_;
              auVar67._20_4_ = auVar106._20_4_ * auVar103._20_4_;
              auVar67._24_4_ = auVar106._24_4_ * auVar103._24_4_;
              auVar67._28_4_ = auVar104._28_4_;
              auVar6 = vfmsub231ps_fma(auVar67,auVar105,auVar115);
              auVar68._4_4_ = auVar115._4_4_ * auVar114._4_4_;
              auVar68._0_4_ = auVar115._0_4_ * auVar114._0_4_;
              auVar68._8_4_ = auVar115._8_4_ * auVar114._8_4_;
              auVar68._12_4_ = auVar115._12_4_ * auVar114._12_4_;
              auVar68._16_4_ = auVar115._16_4_ * auVar114._16_4_;
              auVar68._20_4_ = auVar115._20_4_ * auVar114._20_4_;
              auVar68._24_4_ = auVar115._24_4_ * auVar114._24_4_;
              auVar68._28_4_ = auVar115._28_4_;
              auVar96 = vfmsub231ps_fma(auVar68,auVar113,auVar106);
              auVar69._4_4_ = auVar105._4_4_ * auVar113._4_4_;
              auVar69._0_4_ = auVar105._0_4_ * auVar113._0_4_;
              auVar69._8_4_ = auVar105._8_4_ * auVar113._8_4_;
              auVar69._12_4_ = auVar105._12_4_ * auVar113._12_4_;
              auVar69._16_4_ = auVar105._16_4_ * auVar113._16_4_;
              auVar69._20_4_ = auVar105._20_4_ * auVar113._20_4_;
              auVar69._24_4_ = auVar105._24_4_ * auVar113._24_4_;
              auVar69._28_4_ = auVar105._28_4_;
              auVar7 = vfmsub231ps_fma(auVar69,auVar114,auVar103);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar7));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar6),auVar101);
              auVar103 = vrcp14ps_avx512vl(auVar104);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar32._16_4_ = 0x3f800000;
              auVar32._20_4_ = 0x3f800000;
              auVar32._24_4_ = 0x3f800000;
              auVar32._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar103,auVar104,auVar32);
              auVar94 = vfmadd132ps_fma(auVar115,auVar103,auVar103);
              auVar70._4_4_ = auVar7._4_4_ * auVar132._4_4_;
              auVar70._0_4_ = auVar7._0_4_ * auVar132._0_4_;
              auVar70._8_4_ = auVar7._8_4_ * auVar132._8_4_;
              auVar70._12_4_ = auVar7._12_4_ * auVar132._12_4_;
              auVar70._16_4_ = fVar168 * 0.0;
              auVar70._20_4_ = fVar145 * 0.0;
              auVar70._24_4_ = fVar167 * 0.0;
              auVar70._28_4_ = iVar1;
              auVar96 = vfmadd231ps_fma(auVar70,auVar109,ZEXT1632(auVar96));
              auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar107,ZEXT1632(auVar6));
              fVar168 = auVar94._0_4_;
              fVar145 = auVar94._4_4_;
              fVar167 = auVar94._8_4_;
              fVar175 = auVar94._12_4_;
              auVar103 = ZEXT1632(CONCAT412(auVar96._12_4_ * fVar175,
                                            CONCAT48(auVar96._8_4_ * fVar167,
                                                     CONCAT44(auVar96._4_4_ * fVar145,
                                                              auVar96._0_4_ * fVar168))));
              auVar82._4_4_ = uStack_47c;
              auVar82._0_4_ = local_480;
              auVar82._8_4_ = uStack_478;
              auVar82._12_4_ = uStack_474;
              auVar82._16_4_ = uStack_470;
              auVar82._20_4_ = uStack_46c;
              auVar82._24_4_ = uStack_468;
              auVar82._28_4_ = uStack_464;
              uVar147 = vcmpps_avx512vl(auVar103,auVar82,0xd);
              uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar33._4_4_ = uVar146;
              auVar33._0_4_ = uVar146;
              auVar33._8_4_ = uVar146;
              auVar33._12_4_ = uVar146;
              auVar33._16_4_ = uVar146;
              auVar33._20_4_ = uVar146;
              auVar33._24_4_ = uVar146;
              auVar33._28_4_ = uVar146;
              uVar25 = vcmpps_avx512vl(auVar103,auVar33,2);
              local_370 = (byte)uVar147 & (byte)uVar25 & local_370;
              if (local_370 == 0) goto LAB_01e7a5cc;
              uVar147 = vcmpps_avx512vl(auVar104,auVar101,4);
              if ((local_370 & (byte)uVar147) == 0) {
                local_370 = 0;
              }
              else {
                local_370 = local_370 & (byte)uVar147;
                fVar176 = auVar108._0_4_ * fVar168;
                fVar177 = auVar108._4_4_ * fVar145;
                auVar71._4_4_ = fVar177;
                auVar71._0_4_ = fVar176;
                fVar161 = auVar108._8_4_ * fVar167;
                auVar71._8_4_ = fVar161;
                fVar166 = auVar108._12_4_ * fVar175;
                auVar71._12_4_ = fVar166;
                fVar93 = auVar108._16_4_ * 0.0;
                auVar71._16_4_ = fVar93;
                fVar160 = auVar108._20_4_ * 0.0;
                auVar71._20_4_ = fVar160;
                fVar138 = auVar108._24_4_ * 0.0;
                auVar71._24_4_ = fVar138;
                auVar71._28_4_ = auVar108._28_4_;
                fVar168 = auVar102._0_4_ * fVar168;
                fVar145 = auVar102._4_4_ * fVar145;
                auVar72._4_4_ = fVar145;
                auVar72._0_4_ = fVar168;
                fVar167 = auVar102._8_4_ * fVar167;
                auVar72._8_4_ = fVar167;
                fVar175 = auVar102._12_4_ * fVar175;
                auVar72._12_4_ = fVar175;
                fVar139 = auVar102._16_4_ * 0.0;
                auVar72._16_4_ = fVar139;
                fVar140 = auVar102._20_4_ * 0.0;
                auVar72._20_4_ = fVar140;
                fVar141 = auVar102._24_4_ * 0.0;
                auVar72._24_4_ = fVar141;
                auVar72._28_4_ = auVar102._28_4_;
                auVar185._8_4_ = 0x3f800000;
                auVar185._0_8_ = &DAT_3f8000003f800000;
                auVar185._12_4_ = 0x3f800000;
                auVar185._16_4_ = 0x3f800000;
                auVar185._20_4_ = 0x3f800000;
                auVar185._24_4_ = 0x3f800000;
                auVar185._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar185,auVar71);
                local_660._0_4_ =
                     (uint)(bVar85 & 1) * (int)fVar176 | (uint)!(bool)(bVar85 & 1) * auVar104._0_4_;
                bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
                local_660._4_4_ = (uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar104._4_4_;
                bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                local_660._8_4_ = (uint)bVar18 * (int)fVar161 | (uint)!bVar18 * auVar104._8_4_;
                bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                local_660._12_4_ = (uint)bVar18 * (int)fVar166 | (uint)!bVar18 * auVar104._12_4_;
                bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
                local_660._16_4_ = (uint)bVar18 * (int)fVar93 | (uint)!bVar18 * auVar104._16_4_;
                bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
                local_660._20_4_ = (uint)bVar18 * (int)fVar160 | (uint)!bVar18 * auVar104._20_4_;
                bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                local_660._24_4_ = (uint)bVar18 * (int)fVar138 | (uint)!bVar18 * auVar104._24_4_;
                bVar18 = SUB81(uVar83 >> 7,0);
                local_660._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar104._28_4_;
                auVar104 = vsubps_avx(auVar185,auVar72);
                bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar20 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar21 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar22 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar23 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar24 = SUB81(uVar83 >> 7,0);
                local_300._4_4_ = (uint)bVar18 * (int)fVar145 | (uint)!bVar18 * auVar104._4_4_;
                local_300._0_4_ =
                     (uint)(bVar85 & 1) * (int)fVar168 | (uint)!(bool)(bVar85 & 1) * auVar104._0_4_;
                local_300._8_4_ = (uint)bVar19 * (int)fVar167 | (uint)!bVar19 * auVar104._8_4_;
                local_300._12_4_ = (uint)bVar20 * (int)fVar175 | (uint)!bVar20 * auVar104._12_4_;
                local_300._16_4_ = (uint)bVar21 * (int)fVar139 | (uint)!bVar21 * auVar104._16_4_;
                local_300._20_4_ = (uint)bVar22 * (int)fVar140 | (uint)!bVar22 * auVar104._20_4_;
                local_300._24_4_ = (uint)bVar23 * (int)fVar141 | (uint)!bVar23 * auVar104._24_4_;
                local_300._28_4_ = (uint)bVar24 * auVar102._28_4_ | (uint)!bVar24 * auVar104._28_4_;
                local_680 = auVar103;
              }
            }
            auVar213 = ZEXT3264(local_700);
            if (local_370 != 0) {
              auVar104 = vsubps_avx(ZEXT1632(auVar95),auVar110);
              auVar94 = vfmadd213ps_fma(auVar104,local_660,auVar110);
              uVar146 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar34._4_4_ = uVar146;
              auVar34._0_4_ = uVar146;
              auVar34._8_4_ = uVar146;
              auVar34._12_4_ = uVar146;
              auVar34._16_4_ = uVar146;
              auVar34._20_4_ = uVar146;
              auVar34._24_4_ = uVar146;
              auVar34._28_4_ = uVar146;
              auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                            CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                     CONCAT44(auVar94._4_4_ +
                                                                              auVar94._4_4_,
                                                                              auVar94._0_4_ +
                                                                              auVar94._0_4_)))),
                                         auVar34);
              uVar147 = vcmpps_avx512vl(local_680,auVar104,6);
              local_370 = local_370 & (byte)uVar147;
              if (local_370 != 0) {
                auVar154._8_4_ = 0xbf800000;
                auVar154._0_8_ = 0xbf800000bf800000;
                auVar154._12_4_ = 0xbf800000;
                auVar154._16_4_ = 0xbf800000;
                auVar154._20_4_ = 0xbf800000;
                auVar154._24_4_ = 0xbf800000;
                auVar154._28_4_ = 0xbf800000;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_400 = vfmadd132ps_avx512vl(local_300,auVar154,auVar35);
                local_300 = local_400;
                auVar104 = local_300;
                local_3c0 = (undefined4)lVar92;
                local_3b0 = local_750._0_8_;
                uStack_3a8 = local_750._8_8_;
                local_3a0 = local_510._0_8_;
                uStack_398 = local_510._8_8_;
                local_390 = local_520._0_8_;
                uStack_388 = local_520._8_8_;
                local_380 = local_530._0_8_;
                uStack_378 = local_530._8_8_;
                pGVar14 = (context->scene->geometries).items[uVar91].ptr;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar85 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar85 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_180 = vmovdqa64_avx512vl(auVar199._0_32_);
                  auVar94 = vcvtsi2ss_avx512f(auVar205._0_16_,local_3c0);
                  fVar168 = auVar94._0_4_;
                  local_360[0] = (fVar168 + local_660._0_4_ + 0.0) * (float)local_4a0;
                  local_360[1] = (fVar168 + local_660._4_4_ + 1.0) * local_4a0._4_4_;
                  local_360[2] = (fVar168 + local_660._8_4_ + 2.0) * fStack_498;
                  local_360[3] = (fVar168 + local_660._12_4_ + 3.0) * fStack_494;
                  fStack_350 = (fVar168 + local_660._16_4_ + 4.0) * fStack_490;
                  fStack_34c = (fVar168 + local_660._20_4_ + 5.0) * fStack_48c;
                  fStack_348 = (fVar168 + local_660._24_4_ + 6.0) * fStack_488;
                  fStack_344 = fVar168 + local_660._28_4_ + 7.0;
                  local_300._0_8_ = local_400._0_8_;
                  local_300._8_8_ = local_400._8_8_;
                  local_300._16_8_ = local_400._16_8_;
                  local_300._24_8_ = local_400._24_8_;
                  local_340 = local_300._0_8_;
                  uStack_338 = local_300._8_8_;
                  uStack_330 = local_300._16_8_;
                  uStack_328 = local_300._24_8_;
                  local_320 = local_680;
                  local_6a0 = local_510._0_8_;
                  uStack_698 = local_510._8_8_;
                  uVar83 = 0;
                  uVar87 = (ulong)local_370;
                  for (uVar89 = uVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000
                      ) {
                    uVar83 = uVar83 + 1;
                  }
                  local_6b0 = local_520._0_4_;
                  fStack_6ac = local_520._4_4_;
                  fStack_6a8 = local_520._8_4_;
                  fStack_6a4 = local_520._12_4_;
                  _local_770 = local_530;
                  local_4e0._0_4_ = 1;
                  local_420 = local_660;
                  local_3e0 = local_680;
                  local_3bc = iVar13;
                  local_300 = auVar104;
                  do {
                    local_760 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_240 = local_360[uVar83];
                    local_220 = *(undefined4 *)((long)&local_340 + uVar83 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar83 * 4);
                    local_7a0.context = context->user;
                    fVar145 = 1.0 - local_240;
                    fVar168 = fVar145 * fVar145 * -3.0;
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                              ZEXT416((uint)(local_240 * fVar145)),
                                              ZEXT416(0xc0000000));
                    auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar145)),
                                              ZEXT416((uint)(local_240 * local_240)),
                                              ZEXT416(0x40000000));
                    fVar145 = auVar94._0_4_ * 3.0;
                    fVar167 = auVar95._0_4_ * 3.0;
                    fVar175 = local_240 * local_240 * 3.0;
                    auVar179._0_4_ = fVar175 * (float)local_770._0_4_;
                    auVar179._4_4_ = fVar175 * (float)local_770._4_4_;
                    auVar179._8_4_ = fVar175 * fStack_768;
                    auVar179._12_4_ = fVar175 * fStack_764;
                    auVar150._4_4_ = fVar167;
                    auVar150._0_4_ = fVar167;
                    auVar150._8_4_ = fVar167;
                    auVar150._12_4_ = fVar167;
                    auVar78._4_4_ = fStack_6ac;
                    auVar78._0_4_ = local_6b0;
                    auVar78._8_4_ = fStack_6a8;
                    auVar78._12_4_ = fStack_6a4;
                    auVar94 = vfmadd132ps_fma(auVar150,auVar179,auVar78);
                    auVar163._4_4_ = fVar145;
                    auVar163._0_4_ = fVar145;
                    auVar163._8_4_ = fVar145;
                    auVar163._12_4_ = fVar145;
                    auVar80._8_8_ = uStack_698;
                    auVar80._0_8_ = local_6a0;
                    auVar94 = vfmadd132ps_fma(auVar163,auVar94,auVar80);
                    auVar151._4_4_ = fVar168;
                    auVar151._0_4_ = fVar168;
                    auVar151._8_4_ = fVar168;
                    auVar151._12_4_ = fVar168;
                    auVar94 = vfmadd132ps_fma(auVar151,auVar94,local_750);
                    local_2a0 = auVar94._0_4_;
                    auVar174._8_4_ = 1;
                    auVar174._0_8_ = 0x100000001;
                    auVar174._12_4_ = 1;
                    auVar174._16_4_ = 1;
                    auVar174._20_4_ = 1;
                    auVar174._24_4_ = 1;
                    auVar174._28_4_ = 1;
                    local_280 = vpermps_avx2(auVar174,ZEXT1632(auVar94));
                    auVar182._8_4_ = 2;
                    auVar182._0_8_ = 0x200000002;
                    auVar182._12_4_ = 2;
                    auVar182._16_4_ = 2;
                    auVar182._20_4_ = 2;
                    auVar182._24_4_ = 2;
                    auVar182._28_4_ = 2;
                    local_260 = vpermps_avx2(auVar182,ZEXT1632(auVar94));
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    fStack_23c = local_240;
                    fStack_238 = local_240;
                    fStack_234 = local_240;
                    fStack_230 = local_240;
                    fStack_22c = local_240;
                    fStack_228 = local_240;
                    fStack_224 = local_240;
                    uStack_21c = local_220;
                    uStack_218 = local_220;
                    uStack_214 = local_220;
                    uStack_210 = local_220;
                    uStack_20c = local_220;
                    uStack_208 = local_220;
                    uStack_204 = local_220;
                    local_200 = local_440._0_8_;
                    uStack_1f8 = local_440._8_8_;
                    uStack_1f0 = local_440._16_8_;
                    uStack_1e8 = local_440._24_8_;
                    local_1e0 = local_460;
                    vpcmpeqd_avx2(local_460,local_460);
                    local_1c0 = (local_7a0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7a0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_6e0 = local_2c0._0_8_;
                    uStack_6d8 = local_2c0._8_8_;
                    uStack_6d0 = local_2c0._16_8_;
                    uStack_6c8 = local_2c0._24_8_;
                    local_7a0.valid = (int *)&local_6e0;
                    local_7a0.geometryUserPtr = pGVar14->userPtr;
                    local_7a0.hit = (RTCHitN *)&local_2a0;
                    local_7a0.N = 8;
                    pRVar84 = (RayK<8> *)pGVar14->occlusionFilterN;
                    local_4c0._0_8_ = uVar83;
                    uVar89 = uVar83;
                    local_7a0.ray = (RTCRayN *)ray;
                    if (pRVar84 != (RayK<8> *)0x0) {
                      pRVar84 = (RayK<8> *)(*(code *)pRVar84)(&local_7a0);
                      uVar89 = local_4c0._0_8_;
                    }
                    auVar76._8_8_ = uStack_6d8;
                    auVar76._0_8_ = local_6e0;
                    auVar76._16_8_ = uStack_6d0;
                    auVar76._24_8_ = uStack_6c8;
                    if (auVar76 != (undefined1  [32])0x0) {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var17)(&local_7a0);
                        uVar89 = local_4c0._0_8_;
                      }
                      auVar94 = auVar209._0_16_;
                      auVar77._8_8_ = uStack_6d8;
                      auVar77._0_8_ = local_6e0;
                      auVar77._16_8_ = uStack_6d0;
                      auVar77._24_8_ = uStack_6c8;
                      uVar83 = vptestmd_avx512vl(auVar77,auVar77);
                      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar18 = (bool)((byte)uVar83 & 1);
                      auVar137._0_4_ =
                           (uint)bVar18 * auVar104._0_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x100);
                      bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
                      auVar137._4_4_ =
                           (uint)bVar18 * auVar104._4_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x104);
                      bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                      auVar137._8_4_ =
                           (uint)bVar18 * auVar104._8_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x108);
                      bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                      auVar137._12_4_ =
                           (uint)bVar18 * auVar104._12_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x10c);
                      bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
                      auVar137._16_4_ =
                           (uint)bVar18 * auVar104._16_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x110);
                      bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
                      auVar137._20_4_ =
                           (uint)bVar18 * auVar104._20_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x114);
                      bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                      auVar137._24_4_ =
                           (uint)bVar18 * auVar104._24_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x118);
                      bVar18 = SUB81(uVar83 >> 7,0);
                      auVar137._28_4_ =
                           (uint)bVar18 * auVar104._28_4_ |
                           (uint)!bVar18 * *(int *)(local_7a0.ray + 0x11c);
                      *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar137;
                      pRVar84 = (RayK<8> *)local_7a0.ray;
                      if (auVar77 != (undefined1  [32])0x0) break;
                    }
                    auVar94 = auVar209._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_760;
                    uVar83 = 0;
                    uVar87 = uVar87 ^ 1L << (uVar89 & 0x3f);
                    for (uVar89 = uVar87; (uVar89 & 1) == 0;
                        uVar89 = uVar89 >> 1 | 0x8000000000000000) {
                      uVar83 = uVar83 + 1;
                    }
                    local_4e0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar84 >> 8),uVar87 != 0);
                  } while (uVar87 != 0);
                  bVar85 = local_4e0[0] & 1;
                  auVar94 = vxorps_avx512vl(auVar94,auVar94);
                  auVar209 = ZEXT1664(auVar94);
                  auVar206 = ZEXT3264(local_560);
                  auVar207 = ZEXT3264(local_500);
                  auVar208 = ZEXT3264(local_580);
                  auVar204 = ZEXT3264(local_5a0);
                  auVar213 = ZEXT3264(local_700);
                  auVar210 = ZEXT3264(local_5e0);
                  auVar211 = ZEXT3264(local_600);
                  auVar212 = ZEXT3264(local_620);
                  auVar104 = vmovdqa64_avx512vl(local_180);
                  auVar199 = ZEXT3264(auVar104);
                }
                bVar90 = (bool)(bVar90 | bVar85);
              }
            }
          }
          lVar92 = lVar92 + 8;
          auVar205 = auVar204;
        } while ((int)lVar92 < iVar13);
      }
      if (bVar90 != false) {
        return local_7d9;
      }
      uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar146;
      auVar31._0_4_ = uVar146;
      auVar31._8_4_ = uVar146;
      auVar31._12_4_ = uVar146;
      auVar31._16_4_ = uVar146;
      auVar31._20_4_ = uVar146;
      auVar31._24_4_ = uVar146;
      auVar31._28_4_ = uVar146;
      uVar147 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar91 = (uint)uVar86 & (uint)uVar86 + 0xff & (uint)uVar147;
      uVar86 = (ulong)uVar91;
      local_7d9 = uVar91 != 0;
    } while (local_7d9);
  }
  return local_7d9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }